

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::aggregateVars(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,
               SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *row,int *i)

{
  Item *pIVar1;
  char **ppcVar2;
  uint *puVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  fpclass_type fVar6;
  int32_t iVar7;
  fpclass_type fVar8;
  int32_t iVar9;
  int iVar10;
  pointer pnVar11;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar12;
  pointer pnVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  Tolerances *pTVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var17;
  Item *pIVar18;
  DataKey *pDVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined4 uVar30;
  undefined5 uVar31;
  undefined5 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  bool bVar50;
  undefined8 uVar51;
  bool bVar52;
  bool bVar53;
  int iVar54;
  uint uVar55;
  ulong uVar56;
  AggregationPS *this_00;
  undefined8 *puVar57;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *b;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar58;
  int *piVar59;
  int *piVar60;
  ulong uVar61;
  bool *pbVar62;
  uint uVar63;
  long lVar64;
  cpp_dec_float<50U,_int,_void> *pcVar65;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar66;
  bool *pbVar67;
  long in_FS_OFFSET;
  Real RVar68;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  undefined1 local_e78 [28];
  bool local_e5c [4];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e58;
  byte local_e49;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  undefined1 local_e08 [56];
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_dd0;
  double local_dc8;
  undefined8 uStack_dc0;
  undefined1 local_db8 [64];
  undefined1 local_d78 [64];
  ulong local_d38;
  int32_t local_d30;
  fpclass_type local_d2c;
  undefined1 local_d28 [16];
  ulong local_d10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_30;
  cpp_dec_float<50U,_int,_void> local_cc8;
  cpp_dec_float<50U,_int,_void> local_c88;
  undefined1 local_c48 [48];
  undefined8 local_c18;
  undefined1 local_c08 [48];
  undefined8 local_bd8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_bc8;
  undefined8 uStack_bc0;
  cpp_dec_float<50U,_int,_void> local_bb8;
  cpp_dec_float<50U,_int,_void> local_b78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_29;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aggr_const;
  undefined1 local_ab8 [48];
  undefined8 local_a88;
  undefined1 local_a78 [48];
  undefined8 local_a48;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_43;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  obj_j;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_44;
  fpclass_type local_978;
  shared_ptr<soplex::Tolerances> local_958;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  uint local_928;
  long local_920;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_47;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6b8;
  undefined1 local_678 [64];
  undefined1 local_638 [64];
  undefined1 local_5f8 [64];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b8;
  undefined1 local_578 [64];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_538;
  undefined1 local_4f8 [64];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b8;
  undefined1 local_478 [64];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_438;
  undefined1 local_3f8 [64];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b8;
  undefined1 local_378 [64];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_338;
  undefined1 local_2f8 [64];
  cpp_dec_float<50U,_int,_void> local_2b8;
  cpp_dec_float<50U,_int,_void> local_280;
  cpp_dec_float<50U,_int,_void> local_248;
  cpp_dec_float<50U,_int,_void> local_210;
  cpp_dec_float<50U,_int,_void> local_1d8;
  cpp_dec_float<50U,_int,_void> local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  undefined1 local_128 [64];
  cpp_dec_float<50U,_int,_void> local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_35;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  iVar54 = *i;
  pnVar11 = (lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).right.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_d78._32_8_ = *(undefined8 *)(pnVar11[iVar54].m_backend.data._M_elems + 8);
  local_d78._0_8_ = *(undefined8 *)&pnVar11[iVar54].m_backend.data;
  local_d78._8_8_ = *(undefined8 *)(pnVar11[iVar54].m_backend.data._M_elems + 2);
  puVar3 = pnVar11[iVar54].m_backend.data._M_elems + 4;
  local_d78._16_8_ = *(undefined8 *)puVar3;
  local_d78._24_8_ = *(undefined8 *)(puVar3 + 2);
  local_d78._40_4_ = pnVar11[iVar54].m_backend.exp;
  local_d78[0x2c] = pnVar11[iVar54].m_backend.neg;
  local_d78._48_8_ = *(undefined8 *)&pnVar11[iVar54].m_backend.fpclass;
  pNVar12 = row->m_elem;
  local_d38 = (ulong)pNVar12->idx;
  local_d10 = (ulong)pNVar12[1].idx;
  local_e08._32_8_ = *(undefined8 *)((pNVar12->val).m_backend.data._M_elems + 8);
  local_e08._0_8_ = *(undefined8 *)(pNVar12->val).m_backend.data._M_elems;
  local_e08._8_8_ = *(undefined8 *)((pNVar12->val).m_backend.data._M_elems + 2);
  local_e08._16_8_ = *(undefined8 *)((pNVar12->val).m_backend.data._M_elems + 4);
  local_e08._24_8_ = *(undefined8 *)((pNVar12->val).m_backend.data._M_elems + 6);
  local_e08._40_4_ = (pNVar12->val).m_backend.exp;
  local_e08[0x2c] = (pNVar12->val).m_backend.neg;
  local_e08._48_8_ = *(undefined8 *)&(pNVar12->val).m_backend.fpclass;
  local_db8._32_8_ = *(undefined8 *)(pNVar12[1].val.m_backend.data._M_elems + 8);
  local_db8._0_8_ = *(undefined8 *)pNVar12[1].val.m_backend.data._M_elems;
  local_db8._8_8_ = *(undefined8 *)(pNVar12[1].val.m_backend.data._M_elems + 2);
  local_db8._16_8_ = *(undefined8 *)(pNVar12[1].val.m_backend.data._M_elems + 4);
  local_db8._24_8_ = *(undefined8 *)(pNVar12[1].val.m_backend.data._M_elems + 6);
  local_db8._40_4_ = pNVar12[1].val.m_backend.exp;
  local_db8[0x2c] = pNVar12[1].val.m_backend.neg;
  local_db8._48_8_ = *(undefined8 *)&pNVar12[1].val.m_backend.fpclass;
  pnVar13 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).low.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar14 = *(undefined8 *)(pnVar13[local_d38].m_backend.data._M_elems + 8);
  pnVar11 = pnVar13 + local_d38;
  local_b78.data._M_elems._0_8_ = *(undefined8 *)(pnVar11->m_backend).data._M_elems;
  local_b78.data._M_elems._8_8_ = *(undefined8 *)((pnVar11->m_backend).data._M_elems + 2);
  auVar28 = *(undefined1 (*) [16])&(pnVar11->m_backend).data;
  puVar3 = pnVar13[local_d38].m_backend.data._M_elems + 4;
  uVar21 = *(undefined8 *)puVar3;
  uVar22 = *(undefined8 *)(puVar3 + 2);
  local_b78.exp = pnVar13[local_d38].m_backend.exp;
  local_dc8 = (double)CONCAT44(local_dc8._4_4_,local_b78.exp);
  local_b78.neg = pnVar13[local_d38].m_backend.neg;
  local_d28[0] = local_b78.neg;
  fVar6 = pnVar13[local_d38].m_backend.fpclass;
  iVar7 = pnVar13[local_d38].m_backend.prec_elem;
  local_b78.prec_elem = iVar7;
  local_b78.fpclass = fVar6;
  b = (lp->
      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).up.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start;
  uVar15 = *(undefined8 *)(b[local_d38].m_backend.data._M_elems + 8);
  pnVar58 = b + local_d38;
  local_bb8.data._M_elems._0_8_ = *(undefined8 *)(pnVar58->m_backend).data._M_elems;
  local_bb8.data._M_elems._8_8_ = *(undefined8 *)((pnVar58->m_backend).data._M_elems + 2);
  auVar29 = *(undefined1 (*) [16])(pnVar58->m_backend).data._M_elems;
  puVar3 = b[local_d38].m_backend.data._M_elems + 4;
  uVar23 = *(undefined8 *)puVar3;
  uVar24 = *(undefined8 *)(puVar3 + 2);
  iVar54 = b[local_d38].m_backend.exp;
  bVar52 = b[local_d38].m_backend.neg;
  fVar8 = b[local_d38].m_backend.fpclass;
  iVar9 = b[local_d38].m_backend.prec_elem;
  local_bb8.prec_elem = iVar9;
  local_bb8.fpclass = fVar8;
  local_c88.data._M_elems._32_8_ = *(undefined8 *)(pnVar13[local_d10].m_backend.data._M_elems + 8);
  local_c88.data._M_elems._0_8_ = *(undefined8 *)&pnVar13[local_d10].m_backend.data;
  local_c88.data._M_elems._8_8_ = *(undefined8 *)(pnVar13[local_d10].m_backend.data._M_elems + 2);
  puVar3 = pnVar13[local_d10].m_backend.data._M_elems + 4;
  local_c88.data._M_elems._16_8_ = *(undefined8 *)puVar3;
  local_c88.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
  local_c88.exp = pnVar13[local_d10].m_backend.exp;
  local_c88.neg = pnVar13[local_d10].m_backend.neg;
  local_c88.fpclass = pnVar13[local_d10].m_backend.fpclass;
  local_c88.prec_elem = pnVar13[local_d10].m_backend.prec_elem;
  local_cc8.data._M_elems._32_8_ = *(undefined8 *)(b[local_d10].m_backend.data._M_elems + 8);
  local_cc8.data._M_elems._0_8_ = *(undefined8 *)b[local_d10].m_backend.data._M_elems;
  local_cc8.data._M_elems._8_8_ = *(undefined8 *)(b[local_d10].m_backend.data._M_elems + 2);
  puVar3 = b[local_d10].m_backend.data._M_elems + 4;
  local_cc8.data._M_elems._16_8_ = *(undefined8 *)puVar3;
  local_cc8.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
  local_cc8.exp = b[local_d10].m_backend.exp;
  local_cc8.neg = b[local_d10].m_backend.neg;
  local_cc8.fpclass = b[local_d10].m_backend.fpclass;
  local_cc8.prec_elem = b[local_d10].m_backend.prec_elem;
  local_dd0 = lp;
  local_bb8.data._M_elems._16_8_ = uVar23;
  local_bb8.data._M_elems._24_8_ = uVar24;
  local_bb8.data._M_elems._32_8_ = uVar15;
  local_bb8.exp = iVar54;
  local_bb8.neg = bVar52;
  local_b78.data._M_elems._16_8_ = uVar21;
  local_b78.data._M_elems._24_8_ = uVar22;
  local_b78.data._M_elems._32_8_ = uVar14;
  feastol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_1a0,this);
  local_a78._24_5_ = (undefined5)uVar22;
  local_a78._29_3_ = SUB83(uVar22,5);
  local_a78._40_4_ = local_dc8._0_4_;
  local_a78[0x2c] = (bool)local_d28[0];
  local_a48._4_4_ = iVar7;
  local_a48._0_4_ = fVar6;
  local_ab8._24_5_ = (undefined5)uVar24;
  local_ab8._29_3_ = SUB83(uVar24,5);
  local_a88._4_4_ = iVar9;
  local_a88._0_4_ = fVar8;
  local_ab8._0_16_ = auVar29;
  local_ab8._16_8_ = uVar23;
  local_ab8._32_8_ = uVar15;
  local_ab8._40_4_ = iVar54;
  local_ab8[0x2c] = bVar52;
  local_a78._0_16_ = auVar28;
  local_a78._16_8_ = uVar21;
  local_a78._32_8_ = uVar14;
  relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
            (&result_2,(soplex *)local_a78,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_ab8,b);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = result_2.m_backend.data._M_elems[0];
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = result_2.m_backend.data._M_elems[1];
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = result_2.m_backend.data._M_elems[2];
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = result_2.m_backend.data._M_elems[3];
  local_e78._0_4_ = result_2.m_backend.data._M_elems[4];
  local_e78._4_4_ = result_2.m_backend.data._M_elems[5];
  local_e78._8_4_ = result_2.m_backend.data._M_elems[6];
  local_e78._12_4_ =
       (undefined4)
       (CONCAT35(result_2.m_backend.data._M_elems[7]._1_3_,result_2.m_backend.data._M_elems._24_5_)
       >> 0x20);
  local_e78._16_4_ = result_2.m_backend.data._M_elems[8];
  local_e78._20_4_ =
       (undefined4)
       (CONCAT35(result_2.m_backend.data._M_elems[9]._1_3_,result_2.m_backend.data._M_elems._32_5_)
       >> 0x20);
  local_e78._24_4_ = result_2.m_backend.exp;
  local_e5c[0] = result_2.m_backend.neg;
  local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)result_2.m_backend._48_8_;
  pnVar58 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)(result_2.m_backend._48_8_ & 0xffffffff);
  if ((result_2.m_backend.neg == true) &&
     ((uint)ptr.
            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != 0 || result_2.m_backend.fpclass != cpp_dec_float_finite)) {
    local_e5c[0] = false;
  }
  if (((result_2.m_backend.fpclass != cpp_dec_float_NaN) && (local_1a0.fpclass != cpp_dec_float_NaN)
      ) && (iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)&ptr,&local_1a0), iVar54 < 1)) {
    return OKAY;
  }
  uVar43 = local_c88._48_8_;
  bVar53 = local_c88.neg;
  iVar10 = local_c88.exp;
  uVar41 = local_c88.data._M_elems._32_8_;
  uVar40 = local_c88.data._M_elems._24_8_;
  uVar38 = local_c88.data._M_elems._16_8_;
  uVar36 = local_c88.data._M_elems._8_8_;
  uVar34 = local_c88.data._M_elems._0_8_;
  uVar27 = local_cc8._48_8_;
  bVar52 = local_cc8.neg;
  iVar54 = local_cc8.exp;
  uVar25 = local_cc8.data._M_elems._32_8_;
  uVar20 = local_cc8.data._M_elems._24_8_;
  uVar23 = local_cc8.data._M_elems._16_8_;
  uVar21 = local_cc8.data._M_elems._8_8_;
  uVar14 = local_cc8.data._M_elems._0_8_;
  feastol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_1d8,this);
  uVar44 = local_c88._48_8_;
  uVar42 = local_c88.data._M_elems._32_8_;
  uVar39 = local_c88.data._M_elems._16_8_;
  uVar37 = local_c88.data._M_elems._8_8_;
  uVar35 = local_c88.data._M_elems._0_8_;
  uVar33 = local_cc8._48_8_;
  uVar26 = local_cc8.data._M_elems._32_8_;
  uVar24 = local_cc8.data._M_elems._16_8_;
  uVar22 = local_cc8.data._M_elems._8_8_;
  uVar15 = local_cc8.data._M_elems._0_8_;
  local_c88.data._M_elems[2] = (uint)uVar36;
  local_c88.data._M_elems[3] = SUB84(uVar36,4);
  local_a78._8_4_ = local_c88.data._M_elems[2];
  local_a78._12_4_ = local_c88.data._M_elems[3];
  local_c88.data._M_elems[0] = (uint)uVar34;
  local_c88.data._M_elems[1] = SUB84(uVar34,4);
  local_a78._0_4_ = local_c88.data._M_elems[0];
  local_a78._4_4_ = local_c88.data._M_elems[1];
  local_c88.data._M_elems[4] = (uint)uVar38;
  local_c88.data._M_elems[5] = SUB84(uVar38,4);
  local_a78._16_4_ = local_c88.data._M_elems[4];
  local_a78._20_4_ = local_c88.data._M_elems[5];
  local_a78._24_5_ = (undefined5)uVar40;
  local_a78._29_3_ = SUB83(uVar40,5);
  local_c88.data._M_elems[8] = (uint)uVar41;
  local_c88.data._M_elems[9] = SUB84(uVar41,4);
  local_a78._32_4_ = local_c88.data._M_elems[8];
  local_a78._36_4_ = local_c88.data._M_elems[9];
  local_a78._40_4_ = iVar10;
  local_a78[0x2c] = bVar53;
  local_c88.fpclass = (fpclass_type)uVar43;
  local_c88.prec_elem = SUB84(uVar43,4);
  local_a48._0_4_ = local_c88.fpclass;
  local_a48._4_4_ = local_c88.prec_elem;
  local_cc8.data._M_elems[2] = (uint)uVar21;
  local_cc8.data._M_elems[3] = SUB84(uVar21,4);
  local_ab8._8_4_ = local_cc8.data._M_elems[2];
  local_ab8._12_4_ = local_cc8.data._M_elems[3];
  local_cc8.data._M_elems[0] = (uint)uVar14;
  local_cc8.data._M_elems[1] = SUB84(uVar14,4);
  local_ab8._0_4_ = local_cc8.data._M_elems[0];
  local_ab8._4_4_ = local_cc8.data._M_elems[1];
  local_cc8.data._M_elems[4] = (uint)uVar23;
  local_cc8.data._M_elems[5] = SUB84(uVar23,4);
  local_ab8._16_4_ = local_cc8.data._M_elems[4];
  local_ab8._20_4_ = local_cc8.data._M_elems[5];
  local_ab8._24_5_ = (undefined5)uVar20;
  local_ab8._29_3_ = SUB83(uVar20,5);
  local_cc8.data._M_elems[8] = (uint)uVar25;
  local_cc8.data._M_elems[9] = SUB84(uVar25,4);
  local_ab8._32_4_ = local_cc8.data._M_elems[8];
  local_ab8._36_4_ = local_cc8.data._M_elems[9];
  local_ab8._40_4_ = iVar54;
  local_ab8[0x2c] = bVar52;
  local_cc8.fpclass = (fpclass_type)uVar27;
  local_cc8.prec_elem = SUB84(uVar27,4);
  local_a88._0_4_ = local_cc8.fpclass;
  local_a88._4_4_ = local_cc8.prec_elem;
  local_cc8.data._M_elems._0_8_ = uVar15;
  local_cc8.data._M_elems._8_8_ = uVar22;
  local_cc8.data._M_elems._16_8_ = uVar24;
  local_cc8.data._M_elems._32_8_ = uVar26;
  local_cc8._48_8_ = uVar33;
  local_c88.data._M_elems._0_8_ = uVar35;
  local_c88.data._M_elems._8_8_ = uVar37;
  local_c88.data._M_elems._16_8_ = uVar39;
  local_c88.data._M_elems._32_8_ = uVar42;
  local_c88._48_8_ = uVar44;
  relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
            (&result_2,(soplex *)local_a78,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_ab8,pnVar58);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = result_2.m_backend.data._M_elems[0];
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = result_2.m_backend.data._M_elems[1];
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = result_2.m_backend.data._M_elems[2];
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = result_2.m_backend.data._M_elems[3];
  local_e78._0_4_ = result_2.m_backend.data._M_elems[4];
  local_e78._4_4_ = result_2.m_backend.data._M_elems[5];
  local_e78._8_4_ = result_2.m_backend.data._M_elems[6];
  local_e78._12_4_ =
       (undefined4)
       (CONCAT35(result_2.m_backend.data._M_elems[7]._1_3_,result_2.m_backend.data._M_elems._24_5_)
       >> 0x20);
  local_e78._16_4_ = result_2.m_backend.data._M_elems[8];
  local_e78._20_4_ =
       (undefined4)
       (CONCAT35(result_2.m_backend.data._M_elems[9]._1_3_,result_2.m_backend.data._M_elems._32_5_)
       >> 0x20);
  local_e78._24_4_ = result_2.m_backend.exp;
  local_e5c[0] = result_2.m_backend.neg;
  local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)result_2.m_backend._48_8_;
  if ((result_2.m_backend.neg == true) &&
     ((uint)ptr.
            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != 0 || result_2.m_backend.fpclass != cpp_dec_float_finite)) {
    local_e5c[0] = false;
  }
  if (((result_2.m_backend.fpclass != cpp_dec_float_NaN) && (local_1d8.fpclass != cpp_dec_float_NaN)
      ) && (iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)&ptr,&local_1d8), iVar54 < 1)) {
    return OKAY;
  }
  local_a48._0_4_ = cpp_dec_float_finite;
  local_a48._4_4_ = 10;
  local_a78._0_16_ = (undefined1  [16])0x0;
  local_a78._16_4_ = 0;
  local_a78._20_4_ = 0;
  local_a78._24_5_ = 0;
  local_a78._29_3_ = 0;
  local_a78._32_4_ = 0;
  local_a78._36_4_ = 0;
  local_a78._40_4_ = 0;
  local_a78[0x2c] = false;
  local_a88._0_4_ = cpp_dec_float_finite;
  local_a88._4_4_ = 10;
  local_ab8._0_16_ = (undefined1  [16])0x0;
  local_ab8._16_4_ = 0;
  local_ab8._20_4_ = 0;
  local_ab8._24_5_ = 0;
  local_ab8._29_3_ = 0;
  local_ab8._32_4_ = 0;
  local_ab8._36_4_ = 0;
  local_ab8._40_4_ = 0;
  local_ab8[0x2c] = false;
  local_bd8._0_4_ = cpp_dec_float_finite;
  local_bd8._4_4_ = 10;
  local_c08._0_16_ = (undefined1  [16])0x0;
  local_c08._16_4_ = 0;
  local_c08._20_4_ = 0;
  local_c08._24_5_ = 0;
  local_c08._29_3_ = 0;
  local_c08._32_4_ = 0;
  local_c08._36_4_ = 0;
  local_c08._40_4_ = 0;
  local_c08[0x2c] = false;
  local_c18._0_4_ = cpp_dec_float_finite;
  local_c18._4_4_ = 10;
  local_c48._0_16_ = (undefined1  [16])0x0;
  local_c48._16_4_ = 0;
  local_c48._20_4_ = 0;
  local_c48._24_5_ = 0;
  local_c48._29_3_ = 0;
  local_c48._32_4_ = 0;
  local_c48._36_4_ = 0;
  local_c48._40_4_ = 0;
  local_c48[0x2c] = false;
  result_2.m_backend.data._M_elems[0] = local_e08._0_4_;
  result_2.m_backend.data._M_elems[1] = local_e08._4_4_;
  result_2.m_backend.data._M_elems[2] = local_e08._8_4_;
  result_2.m_backend.data._M_elems[3] = local_e08._12_4_;
  result_2.m_backend.data._M_elems[4] = local_e08._16_4_;
  result_2.m_backend.data._M_elems[5] = local_e08._20_4_;
  result_2.m_backend.data._M_elems._24_5_ = SUB85(local_e08._24_8_,0);
  result_2.m_backend.data._M_elems[7]._1_3_ = SUB83(local_e08._24_8_,5);
  result_2.m_backend.data._M_elems._32_5_ = SUB85(local_e08._32_8_,0);
  result_2.m_backend.data._M_elems[9]._1_3_ = SUB83(local_e08._32_8_,5);
  result_2.m_backend.exp = local_e08._40_4_;
  result_2.m_backend.neg = local_e08[0x2c];
  result_2.m_backend.fpclass = local_e08._48_4_;
  result_2.m_backend.prec_elem = local_e08._52_4_;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
            (&result_2.m_backend,(cpp_dec_float<50U,_int,_void> *)local_db8);
  if (result_2.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_002f7f60:
    pSVar66 = local_dd0;
    result_2.m_backend.data._M_elems[2] = local_e08._8_4_;
    result_2.m_backend.data._M_elems[3] = local_e08._12_4_;
    result_2.m_backend.data._M_elems[0] = local_e08._0_4_;
    result_2.m_backend.data._M_elems[1] = local_e08._4_4_;
    result_2.m_backend.data._M_elems[4] = local_e08._16_4_;
    result_2.m_backend.data._M_elems[5] = local_e08._20_4_;
    result_2.m_backend.data._M_elems._24_5_ = SUB85(local_e08._24_8_,0);
    result_2.m_backend.data._M_elems[7]._1_3_ = SUB83(local_e08._24_8_,5);
    result_2.m_backend.data._M_elems._32_5_ = SUB85(local_e08._32_8_,0);
    result_2.m_backend.data._M_elems[9]._1_3_ = SUB83(local_e08._32_8_,5);
    result_2.m_backend.exp = local_e08._40_4_;
    result_2.m_backend.neg = local_e08[0x2c];
    result_2.m_backend.fpclass = local_e08._48_4_;
    result_2.m_backend.prec_elem = local_e08._52_4_;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&result_2.m_backend,(cpp_dec_float<50U,_int,_void> *)local_db8);
    if (result_2.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_002fb884:
      puVar57 = (undefined8 *)__cxa_allocate_exception(0x28);
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_e78;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&ptr,"XMAISM12 This should never happen.","");
      *puVar57 = &PTR__SPxException_006a9ee8;
      puVar57[1] = puVar57 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar57 + 1),
                 ptr.
                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,(long)&(ptr.
                                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_PostStep +
                         CONCAT44(ptr.
                                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi._4_4_,
                                  (uint)ptr.
                                        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi));
      *puVar57 = &PTR__SPxException_006a9ec0;
      __cxa_throw(puVar57,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._4_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._4_4_ = 0;
    local_e78._0_4_ = 0;
    local_e78._4_4_ = 0;
    local_e78._8_4_ = 0;
    local_e78._12_4_ = 0;
    local_e78._16_4_ = 0;
    local_e78._20_4_ = 0;
    local_e78._24_4_ = 0;
    local_e5c[0] = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&ptr,0.0);
    iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&result_2.m_backend,(cpp_dec_float<50U,_int,_void> *)&ptr);
    if (iVar54 < 1) goto LAB_002fb884;
    ::soplex::infinity::__tls_init();
    local_dc8 = *(double *)(in_FS_OFFSET + -8);
    uStack_dc0 = 0;
    local_d28._0_8_ = -local_dc8;
    local_d28._8_4_ = 0;
    local_d28._12_4_ = 0x80000000;
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT416(0);
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems._24_5_ = 0;
    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_2,(double)local_d28._0_8_);
    if (((local_c88.fpclass == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_c88,&result_2.m_backend), 0 < iVar54)) {
      obj_j.m_backend.data._M_elems[0] = local_db8._0_4_;
      obj_j.m_backend.data._M_elems[1] = local_db8._4_4_;
      obj_j.m_backend.data._M_elems[2] = local_db8._8_4_;
      obj_j.m_backend.data._M_elems[3] = local_db8._12_4_;
      obj_j.m_backend.data._M_elems[4] = local_db8._16_4_;
      obj_j.m_backend.data._M_elems[5] = local_db8._20_4_;
      obj_j.m_backend.data._M_elems[6] = local_db8._24_4_;
      obj_j.m_backend.data._M_elems[7] = local_db8._28_4_;
      obj_j.m_backend.data._M_elems[8] = local_db8._32_4_;
      obj_j.m_backend.data._M_elems[9] = local_db8._36_4_;
      obj_j.m_backend.exp = local_db8._40_4_;
      obj_j.m_backend.neg = local_db8[0x2c];
      obj_j.m_backend.fpclass = local_db8._48_4_;
      obj_j.m_backend.prec_elem = local_db8._52_4_;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&obj_j.m_backend,&local_c88);
      aggr_const.m_backend.data._M_elems[0] = local_d78._0_4_;
      aggr_const.m_backend.data._M_elems[1] = local_d78._4_4_;
      aggr_const.m_backend.data._M_elems[2] = local_d78._8_4_;
      aggr_const.m_backend.data._M_elems[3] = local_d78._12_4_;
      aggr_const.m_backend.data._M_elems[4] = local_d78._16_4_;
      aggr_const.m_backend.data._M_elems[5] = local_d78._20_4_;
      aggr_const.m_backend.data._M_elems._24_5_ = SUB85(local_d78._24_8_,0);
      aggr_const.m_backend.data._M_elems[7]._1_3_ = SUB83(local_d78._24_8_,5);
      aggr_const.m_backend.data._M_elems._32_5_ = SUB85(local_d78._32_8_,0);
      aggr_const.m_backend.data._M_elems[9]._1_3_ = SUB83(local_d78._32_8_,5);
      aggr_const.m_backend.exp = local_d78._40_4_;
      aggr_const.m_backend.neg = local_d78[0x2c];
      aggr_const.m_backend.fpclass = local_d78._48_4_;
      aggr_const.m_backend.prec_elem = local_d78._52_4_;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&aggr_const.m_backend,&obj_j.m_backend);
      local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e78._0_4_ = 0;
      local_e78._4_4_ = 0;
      local_e78._8_4_ = 0;
      local_e78._12_4_ = 0;
      local_e78._16_4_ = 0;
      local_e78._20_4_ = 0;
      local_e78._24_4_ = 0;
      local_e5c[0] = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)&ptr,&aggr_const.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)local_e08);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e78._0_4_ = 0;
      local_e78._4_4_ = 0;
      local_e78._8_4_ = 0;
      local_e78._12_4_ = 0;
      local_e78._16_4_ = 0;
      local_e78._20_4_ = 0;
      local_e78._24_4_ = 0;
      local_e5c[0] = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&ptr,(double)local_d28._0_8_);
    }
    local_a78._36_4_ = local_e78._20_4_;
    local_a78._32_4_ = local_e78._16_4_;
    local_a78._4_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._4_4_;
    local_a78._0_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    local_a78._12_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi._4_4_;
    local_a78._8_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
    local_a78._20_4_ = local_e78._4_4_;
    local_a78._16_4_ = local_e78._0_4_;
    local_a78._24_5_ = (undefined5)CONCAT44(local_e78._12_4_,local_e78._8_4_);
    local_a78._29_3_ = SUB43(local_e78._12_4_,1);
    local_a78._40_4_ = local_e78._24_4_;
    local_a78[0x2c] = local_e5c[0];
    local_a48 = local_e58._M_pi;
    ::soplex::infinity::__tls_init();
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems._24_5_ = 0;
    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_2,local_dc8);
    if (((local_cc8.fpclass == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_cc8,&result_2.m_backend), iVar54 < 0)) {
      obj_j.m_backend.data._M_elems[0] = local_db8._0_4_;
      obj_j.m_backend.data._M_elems[1] = local_db8._4_4_;
      obj_j.m_backend.data._M_elems[2] = local_db8._8_4_;
      obj_j.m_backend.data._M_elems[3] = local_db8._12_4_;
      obj_j.m_backend.data._M_elems[4] = local_db8._16_4_;
      obj_j.m_backend.data._M_elems[5] = local_db8._20_4_;
      obj_j.m_backend.data._M_elems[6] = local_db8._24_4_;
      obj_j.m_backend.data._M_elems[7] = local_db8._28_4_;
      obj_j.m_backend.data._M_elems[8] = local_db8._32_4_;
      obj_j.m_backend.data._M_elems[9] = local_db8._36_4_;
      obj_j.m_backend.exp = local_db8._40_4_;
      obj_j.m_backend.neg = local_db8[0x2c];
      obj_j.m_backend.fpclass = local_db8._48_4_;
      obj_j.m_backend.prec_elem = local_db8._52_4_;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&obj_j.m_backend,&local_cc8);
      aggr_const.m_backend.data._M_elems[0] = local_d78._0_4_;
      aggr_const.m_backend.data._M_elems[1] = local_d78._4_4_;
      aggr_const.m_backend.data._M_elems[2] = local_d78._8_4_;
      aggr_const.m_backend.data._M_elems[3] = local_d78._12_4_;
      aggr_const.m_backend.data._M_elems[4] = local_d78._16_4_;
      aggr_const.m_backend.data._M_elems[5] = local_d78._20_4_;
      aggr_const.m_backend.data._M_elems._24_5_ = SUB85(local_d78._24_8_,0);
      aggr_const.m_backend.data._M_elems[7]._1_3_ = SUB83(local_d78._24_8_,5);
      aggr_const.m_backend.data._M_elems._32_5_ = SUB85(local_d78._32_8_,0);
      aggr_const.m_backend.data._M_elems[9]._1_3_ = SUB83(local_d78._32_8_,5);
      aggr_const.m_backend.exp = local_d78._40_4_;
      aggr_const.m_backend.neg = local_d78[0x2c];
      aggr_const.m_backend.fpclass = local_d78._48_4_;
      aggr_const.m_backend.prec_elem = local_d78._52_4_;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&aggr_const.m_backend,&obj_j.m_backend);
      local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e78._0_4_ = 0;
      local_e78._4_4_ = 0;
      local_e78._8_4_ = 0;
      local_e78._12_4_ = 0;
      local_e78._16_4_ = 0;
      local_e78._20_4_ = 0;
      local_e78._24_4_ = 0;
      local_e5c[0] = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)&ptr,&aggr_const.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)local_e08);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e78._0_4_ = 0;
      local_e78._4_4_ = 0;
      local_e78._8_4_ = 0;
      local_e78._12_4_ = 0;
      local_e78._16_4_ = 0;
      local_e78._20_4_ = 0;
      local_e78._24_4_ = 0;
      local_e5c[0] = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&ptr,local_dc8);
    }
    local_ab8._36_4_ = local_e78._20_4_;
    local_ab8._32_4_ = local_e78._16_4_;
    local_ab8._4_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._4_4_;
    local_ab8._0_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    local_ab8._12_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi._4_4_;
    local_ab8._8_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
    local_ab8._20_4_ = local_e78._4_4_;
    local_ab8._16_4_ = local_e78._0_4_;
    local_ab8._24_5_ = (undefined5)CONCAT44(local_e78._12_4_,local_e78._8_4_);
    local_ab8._29_3_ = SUB43(local_e78._12_4_,1);
    local_ab8._40_4_ = local_e78._24_4_;
    local_ab8[0x2c] = local_e5c[0];
    local_a88 = local_e58._M_pi;
    ::soplex::infinity::__tls_init();
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems._24_5_ = 0;
    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_2,(double)local_d28._0_8_);
    if (((local_b78.fpclass == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_b78,&result_2.m_backend), 0 < iVar54)) {
      obj_j.m_backend.data._M_elems[0] = local_e08._0_4_;
      obj_j.m_backend.data._M_elems[1] = local_e08._4_4_;
      obj_j.m_backend.data._M_elems[2] = local_e08._8_4_;
      obj_j.m_backend.data._M_elems[3] = local_e08._12_4_;
      obj_j.m_backend.data._M_elems[4] = local_e08._16_4_;
      obj_j.m_backend.data._M_elems[5] = local_e08._20_4_;
      obj_j.m_backend.data._M_elems[6] = local_e08._24_4_;
      obj_j.m_backend.data._M_elems[7] = local_e08._28_4_;
      obj_j.m_backend.data._M_elems[8] = local_e08._32_4_;
      obj_j.m_backend.data._M_elems[9] = local_e08._36_4_;
      obj_j.m_backend.exp = local_e08._40_4_;
      obj_j.m_backend.neg = local_e08[0x2c];
      obj_j.m_backend.fpclass = local_e08._48_4_;
      obj_j.m_backend.prec_elem = local_e08._52_4_;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&obj_j.m_backend,&local_b78);
      aggr_const.m_backend.data._M_elems[0] = local_d78._0_4_;
      aggr_const.m_backend.data._M_elems[1] = local_d78._4_4_;
      aggr_const.m_backend.data._M_elems[2] = local_d78._8_4_;
      aggr_const.m_backend.data._M_elems[3] = local_d78._12_4_;
      aggr_const.m_backend.data._M_elems[4] = local_d78._16_4_;
      aggr_const.m_backend.data._M_elems[5] = local_d78._20_4_;
      aggr_const.m_backend.data._M_elems._24_5_ = SUB85(local_d78._24_8_,0);
      aggr_const.m_backend.data._M_elems[7]._1_3_ = SUB83(local_d78._24_8_,5);
      aggr_const.m_backend.data._M_elems._32_5_ = SUB85(local_d78._32_8_,0);
      aggr_const.m_backend.data._M_elems[9]._1_3_ = SUB83(local_d78._32_8_,5);
      aggr_const.m_backend.exp = local_d78._40_4_;
      aggr_const.m_backend.neg = local_d78[0x2c];
      aggr_const.m_backend.fpclass = local_d78._48_4_;
      aggr_const.m_backend.prec_elem = local_d78._52_4_;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&aggr_const.m_backend,&obj_j.m_backend);
      local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e78._0_4_ = 0;
      local_e78._4_4_ = 0;
      local_e78._8_4_ = 0;
      local_e78._12_4_ = 0;
      local_e78._16_4_ = 0;
      local_e78._20_4_ = 0;
      local_e78._24_4_ = 0;
      local_e5c[0] = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)&ptr,&aggr_const.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)local_db8);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e78._0_4_ = 0;
      local_e78._4_4_ = 0;
      local_e78._8_4_ = 0;
      local_e78._12_4_ = 0;
      local_e78._16_4_ = 0;
      local_e78._20_4_ = 0;
      local_e78._24_4_ = 0;
      local_e5c[0] = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&ptr,(double)local_d28._0_8_);
    }
    local_c08._36_4_ = local_e78._20_4_;
    local_c08._32_4_ = local_e78._16_4_;
    local_c08._4_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._4_4_;
    local_c08._0_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    local_c08._12_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi._4_4_;
    local_c08._8_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
    local_c08._20_4_ = local_e78._4_4_;
    local_c08._16_4_ = local_e78._0_4_;
    local_c08._24_5_ = (undefined5)CONCAT44(local_e78._12_4_,local_e78._8_4_);
    local_c08._29_3_ = SUB43(local_e78._12_4_,1);
    local_c08._40_4_ = local_e78._24_4_;
    local_c08[0x2c] = local_e5c[0];
    local_bd8 = local_e58._M_pi;
    ::soplex::infinity::__tls_init();
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems[0] = 0;
    result_2.m_backend.data._M_elems[1] = 0;
    result_2.m_backend.data._M_elems[2] = 0;
    result_2.m_backend.data._M_elems[3] = 0;
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems._24_5_ = 0;
    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_2,local_dc8);
    if (((local_bb8.fpclass == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_bb8,&result_2.m_backend), iVar54 < 0)) {
      pcVar65 = &local_bb8;
      goto LAB_002f8bed;
    }
LAB_002f8537:
    ::soplex::infinity::__tls_init();
    local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._4_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._4_4_ = 0;
    local_e78._0_4_ = 0;
    local_e78._4_4_ = 0;
    local_e78._8_4_ = 0;
    local_e78._12_4_ = 0;
    local_e78._16_4_ = 0;
    local_e78._20_4_ = 0;
    local_e78._24_4_ = 0;
    local_e5c[0] = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&ptr,local_dc8);
  }
  else {
    local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._4_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._4_4_ = 0;
    local_e78._0_4_ = 0;
    local_e78._4_4_ = 0;
    local_e78._8_4_ = 0;
    local_e78._12_4_ = 0;
    local_e78._16_4_ = 0;
    local_e78._20_4_ = 0;
    local_e78._24_4_ = 0;
    local_e5c[0] = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&ptr,0.0);
    iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&result_2.m_backend,(cpp_dec_float<50U,_int,_void> *)&ptr);
    pSVar66 = local_dd0;
    if (-1 < iVar54) goto LAB_002f7f60;
    ::soplex::infinity::__tls_init();
    local_dc8 = *(double *)(in_FS_OFFSET + -8);
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems._24_5_ = 0;
    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    uStack_dc0 = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_2,local_dc8);
    if (((local_cc8.fpclass == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_cc8,&result_2.m_backend), iVar54 < 0)) {
      obj_j.m_backend.data._M_elems[0] = local_db8._0_4_;
      obj_j.m_backend.data._M_elems[1] = local_db8._4_4_;
      obj_j.m_backend.data._M_elems[2] = local_db8._8_4_;
      obj_j.m_backend.data._M_elems[3] = local_db8._12_4_;
      obj_j.m_backend.data._M_elems[4] = local_db8._16_4_;
      obj_j.m_backend.data._M_elems[5] = local_db8._20_4_;
      obj_j.m_backend.data._M_elems[6] = local_db8._24_4_;
      obj_j.m_backend.data._M_elems[7] = local_db8._28_4_;
      obj_j.m_backend.data._M_elems[8] = local_db8._32_4_;
      obj_j.m_backend.data._M_elems[9] = local_db8._36_4_;
      obj_j.m_backend.exp = local_db8._40_4_;
      obj_j.m_backend.neg = local_db8[0x2c];
      obj_j.m_backend.fpclass = local_db8._48_4_;
      obj_j.m_backend.prec_elem = local_db8._52_4_;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&obj_j.m_backend,&local_cc8);
      aggr_const.m_backend.data._M_elems[0] = local_d78._0_4_;
      aggr_const.m_backend.data._M_elems[1] = local_d78._4_4_;
      aggr_const.m_backend.data._M_elems[2] = local_d78._8_4_;
      aggr_const.m_backend.data._M_elems[3] = local_d78._12_4_;
      aggr_const.m_backend.data._M_elems[4] = local_d78._16_4_;
      aggr_const.m_backend.data._M_elems[5] = local_d78._20_4_;
      aggr_const.m_backend.data._M_elems._24_5_ = SUB85(local_d78._24_8_,0);
      aggr_const.m_backend.data._M_elems[7]._1_3_ = SUB83(local_d78._24_8_,5);
      aggr_const.m_backend.data._M_elems._32_5_ = SUB85(local_d78._32_8_,0);
      aggr_const.m_backend.data._M_elems[9]._1_3_ = SUB83(local_d78._32_8_,5);
      aggr_const.m_backend.exp = local_d78._40_4_;
      aggr_const.m_backend.neg = local_d78[0x2c];
      aggr_const.m_backend.fpclass = local_d78._48_4_;
      aggr_const.m_backend.prec_elem = local_d78._52_4_;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&aggr_const.m_backend,&obj_j.m_backend);
      local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e78._0_4_ = 0;
      local_e78._4_4_ = 0;
      local_e78._8_4_ = 0;
      local_e78._12_4_ = 0;
      local_e78._16_4_ = 0;
      local_e78._20_4_ = 0;
      local_e78._24_4_ = 0;
      local_e5c[0] = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)&ptr,&aggr_const.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)local_e08);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e78._0_4_ = 0;
      local_e78._4_4_ = 0;
      local_e78._8_4_ = 0;
      local_e78._12_4_ = 0;
      local_e78._16_4_ = 0;
      local_e78._20_4_ = 0;
      local_e78._24_4_ = 0;
      local_e5c[0] = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&ptr,-local_dc8);
    }
    local_a78._36_4_ = local_e78._20_4_;
    local_a78._32_4_ = local_e78._16_4_;
    local_a78._4_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._4_4_;
    local_a78._0_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    local_a78._12_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi._4_4_;
    local_a78._8_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
    local_a78._20_4_ = local_e78._4_4_;
    local_a78._16_4_ = local_e78._0_4_;
    local_a78._24_5_ = (undefined5)CONCAT44(local_e78._12_4_,local_e78._8_4_);
    local_a78._29_3_ = SUB43(local_e78._12_4_,1);
    local_a78._40_4_ = local_e78._24_4_;
    local_a78[0x2c] = local_e5c[0];
    local_a48 = local_e58._M_pi;
    ::soplex::infinity::__tls_init();
    local_d28._0_8_ = -local_dc8;
    local_d28._8_4_ = (undefined4)uStack_dc0;
    local_d28._12_4_ = uStack_dc0._4_4_ ^ 0x80000000;
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems._24_5_ = 0;
    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_2,(double)local_d28._0_8_);
    if (((local_c88.fpclass == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_c88,&result_2.m_backend), 0 < iVar54)) {
      obj_j.m_backend.data._M_elems[0] = local_db8._0_4_;
      obj_j.m_backend.data._M_elems[1] = local_db8._4_4_;
      obj_j.m_backend.data._M_elems[2] = local_db8._8_4_;
      obj_j.m_backend.data._M_elems[3] = local_db8._12_4_;
      obj_j.m_backend.data._M_elems[4] = local_db8._16_4_;
      obj_j.m_backend.data._M_elems[5] = local_db8._20_4_;
      obj_j.m_backend.data._M_elems[6] = local_db8._24_4_;
      obj_j.m_backend.data._M_elems[7] = local_db8._28_4_;
      obj_j.m_backend.data._M_elems[8] = local_db8._32_4_;
      obj_j.m_backend.data._M_elems[9] = local_db8._36_4_;
      obj_j.m_backend.exp = local_db8._40_4_;
      obj_j.m_backend.neg = local_db8[0x2c];
      obj_j.m_backend.fpclass = local_db8._48_4_;
      obj_j.m_backend.prec_elem = local_db8._52_4_;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&obj_j.m_backend,&local_c88);
      aggr_const.m_backend.data._M_elems[0] = local_d78._0_4_;
      aggr_const.m_backend.data._M_elems[1] = local_d78._4_4_;
      aggr_const.m_backend.data._M_elems[2] = local_d78._8_4_;
      aggr_const.m_backend.data._M_elems[3] = local_d78._12_4_;
      aggr_const.m_backend.data._M_elems[4] = local_d78._16_4_;
      aggr_const.m_backend.data._M_elems[5] = local_d78._20_4_;
      aggr_const.m_backend.data._M_elems._24_5_ = SUB85(local_d78._24_8_,0);
      aggr_const.m_backend.data._M_elems[7]._1_3_ = SUB83(local_d78._24_8_,5);
      aggr_const.m_backend.data._M_elems._32_5_ = SUB85(local_d78._32_8_,0);
      aggr_const.m_backend.data._M_elems[9]._1_3_ = SUB83(local_d78._32_8_,5);
      aggr_const.m_backend.exp = local_d78._40_4_;
      aggr_const.m_backend.neg = local_d78[0x2c];
      aggr_const.m_backend.fpclass = local_d78._48_4_;
      aggr_const.m_backend.prec_elem = local_d78._52_4_;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&aggr_const.m_backend,&obj_j.m_backend);
      local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e78._0_4_ = 0;
      local_e78._4_4_ = 0;
      local_e78._8_4_ = 0;
      local_e78._12_4_ = 0;
      local_e78._16_4_ = 0;
      local_e78._20_4_ = 0;
      local_e78._24_4_ = 0;
      local_e5c[0] = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)&ptr,&aggr_const.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)local_e08);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e78._0_4_ = 0;
      local_e78._4_4_ = 0;
      local_e78._8_4_ = 0;
      local_e78._12_4_ = 0;
      local_e78._16_4_ = 0;
      local_e78._20_4_ = 0;
      local_e78._24_4_ = 0;
      local_e5c[0] = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&ptr,local_dc8);
    }
    local_ab8._36_4_ = local_e78._20_4_;
    local_ab8._32_4_ = local_e78._16_4_;
    local_ab8._4_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._4_4_;
    local_ab8._0_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    local_ab8._12_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi._4_4_;
    local_ab8._8_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
    local_ab8._20_4_ = local_e78._4_4_;
    local_ab8._16_4_ = local_e78._0_4_;
    local_ab8._24_5_ = (undefined5)CONCAT44(local_e78._12_4_,local_e78._8_4_);
    local_ab8._29_3_ = SUB43(local_e78._12_4_,1);
    local_ab8._40_4_ = local_e78._24_4_;
    local_ab8[0x2c] = local_e5c[0];
    local_a88 = local_e58._M_pi;
    ::soplex::infinity::__tls_init();
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems._24_5_ = 0;
    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_2,local_dc8);
    if (((local_bb8.fpclass == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_bb8,&result_2.m_backend), iVar54 < 0)) {
      obj_j.m_backend.data._M_elems[0] = local_e08._0_4_;
      obj_j.m_backend.data._M_elems[1] = local_e08._4_4_;
      obj_j.m_backend.data._M_elems[2] = local_e08._8_4_;
      obj_j.m_backend.data._M_elems[3] = local_e08._12_4_;
      obj_j.m_backend.data._M_elems[4] = local_e08._16_4_;
      obj_j.m_backend.data._M_elems[5] = local_e08._20_4_;
      obj_j.m_backend.data._M_elems[6] = local_e08._24_4_;
      obj_j.m_backend.data._M_elems[7] = local_e08._28_4_;
      obj_j.m_backend.data._M_elems[8] = local_e08._32_4_;
      obj_j.m_backend.data._M_elems[9] = local_e08._36_4_;
      obj_j.m_backend.exp = local_e08._40_4_;
      obj_j.m_backend.neg = local_e08[0x2c];
      obj_j.m_backend.fpclass = local_e08._48_4_;
      obj_j.m_backend.prec_elem = local_e08._52_4_;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&obj_j.m_backend,&local_bb8);
      aggr_const.m_backend.data._M_elems[0] = local_d78._0_4_;
      aggr_const.m_backend.data._M_elems[1] = local_d78._4_4_;
      aggr_const.m_backend.data._M_elems[2] = local_d78._8_4_;
      aggr_const.m_backend.data._M_elems[3] = local_d78._12_4_;
      aggr_const.m_backend.data._M_elems[4] = local_d78._16_4_;
      aggr_const.m_backend.data._M_elems[5] = local_d78._20_4_;
      aggr_const.m_backend.data._M_elems._24_5_ = SUB85(local_d78._24_8_,0);
      aggr_const.m_backend.data._M_elems[7]._1_3_ = SUB83(local_d78._24_8_,5);
      aggr_const.m_backend.data._M_elems._32_5_ = SUB85(local_d78._32_8_,0);
      aggr_const.m_backend.data._M_elems[9]._1_3_ = SUB83(local_d78._32_8_,5);
      aggr_const.m_backend.exp = local_d78._40_4_;
      aggr_const.m_backend.neg = local_d78[0x2c];
      aggr_const.m_backend.fpclass = local_d78._48_4_;
      aggr_const.m_backend.prec_elem = local_d78._52_4_;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&aggr_const.m_backend,&obj_j.m_backend);
      local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e78._0_4_ = 0;
      local_e78._4_4_ = 0;
      local_e78._8_4_ = 0;
      local_e78._12_4_ = 0;
      local_e78._16_4_ = 0;
      local_e78._20_4_ = 0;
      local_e78._24_4_ = 0;
      local_e5c[0] = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)&ptr,&aggr_const.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)local_db8);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e78._0_4_ = 0;
      local_e78._4_4_ = 0;
      local_e78._8_4_ = 0;
      local_e78._12_4_ = 0;
      local_e78._16_4_ = 0;
      local_e78._20_4_ = 0;
      local_e78._24_4_ = 0;
      local_e5c[0] = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&ptr,(double)local_d28._0_8_);
    }
    local_c08._36_4_ = local_e78._20_4_;
    local_c08._32_4_ = local_e78._16_4_;
    local_c08._4_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._4_4_;
    local_c08._0_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    local_c08._12_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi._4_4_;
    local_c08._8_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
    local_c08._20_4_ = local_e78._4_4_;
    local_c08._16_4_ = local_e78._0_4_;
    local_c08._24_5_ = (undefined5)CONCAT44(local_e78._12_4_,local_e78._8_4_);
    local_c08._29_3_ = SUB43(local_e78._12_4_,1);
    local_c08._40_4_ = local_e78._24_4_;
    local_c08[0x2c] = local_e5c[0];
    local_bd8 = local_e58._M_pi;
    ::soplex::infinity::__tls_init();
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems[0] = 0;
    result_2.m_backend.data._M_elems[1] = 0;
    result_2.m_backend.data._M_elems[2] = 0;
    result_2.m_backend.data._M_elems[3] = 0;
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems._24_5_ = 0;
    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_2,(double)local_d28._0_8_);
    if (((local_b78.fpclass != cpp_dec_float_NaN) &&
        (result_2.m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_b78,&result_2.m_backend), iVar54 < 1)) goto LAB_002f8537;
    pcVar65 = &local_b78;
LAB_002f8bed:
    obj_j.m_backend.data._M_elems._0_8_ = local_e08._0_8_;
    obj_j.m_backend.data._M_elems._8_8_ = local_e08._8_8_;
    obj_j.m_backend.data._M_elems._16_8_ = local_e08._16_8_;
    obj_j.m_backend.data._M_elems._24_8_ = local_e08._24_8_;
    obj_j.m_backend.data._M_elems._32_8_ = local_e08._32_8_;
    obj_j.m_backend.exp = local_e08._40_4_;
    obj_j.m_backend.neg = local_e08[0x2c];
    obj_j.m_backend._48_8_ = local_e08._48_8_;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&obj_j.m_backend,pcVar65);
    aggr_const.m_backend.data._M_elems[0] = local_d78._0_4_;
    aggr_const.m_backend.data._M_elems[1] = local_d78._4_4_;
    aggr_const.m_backend.data._M_elems[2] = local_d78._8_4_;
    aggr_const.m_backend.data._M_elems[3] = local_d78._12_4_;
    aggr_const.m_backend.data._M_elems[4] = local_d78._16_4_;
    aggr_const.m_backend.data._M_elems[5] = local_d78._20_4_;
    aggr_const.m_backend.data._M_elems._24_5_ = SUB85(local_d78._24_8_,0);
    aggr_const.m_backend.data._M_elems[7]._1_3_ = SUB83(local_d78._24_8_,5);
    aggr_const.m_backend.data._M_elems._32_5_ = SUB85(local_d78._32_8_,0);
    aggr_const.m_backend.data._M_elems[9]._1_3_ = SUB83(local_d78._32_8_,5);
    aggr_const.m_backend.exp = local_d78._40_4_;
    aggr_const.m_backend.neg = local_d78[0x2c];
    aggr_const.m_backend.fpclass = local_d78._48_4_;
    aggr_const.m_backend.prec_elem = local_d78._52_4_;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              (&aggr_const.m_backend,&obj_j.m_backend);
    local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._4_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._4_4_ = 0;
    local_e78._0_4_ = 0;
    local_e78._4_4_ = 0;
    local_e78._8_4_ = 0;
    local_e78._12_4_ = 0;
    local_e78._16_4_ = 0;
    local_e78._20_4_ = 0;
    local_e78._24_4_ = 0;
    local_e5c[0] = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              ((cpp_dec_float<50U,_int,_void> *)&ptr,&aggr_const.m_backend,
               (cpp_dec_float<50U,_int,_void> *)local_db8);
  }
  local_c48._36_4_ = local_e78._20_4_;
  local_c48._32_4_ = local_e78._16_4_;
  local_c48._4_4_ =
       ptr.
       super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr._4_4_;
  local_c48._0_4_ =
       (uint)ptr.
             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  local_c48._12_4_ =
       ptr.
       super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi._4_4_;
  local_c48._8_4_ =
       (uint)ptr.
             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
  local_c48._20_4_ = local_e78._4_4_;
  local_c48._16_4_ = local_e78._0_4_;
  local_c48._24_5_ = (undefined5)CONCAT44(local_e78._12_4_,local_e78._8_4_);
  local_c48._29_3_ = SUB43(local_e78._12_4_,1);
  local_c48._40_4_ = local_e78._24_4_;
  local_c48[0x2c] = local_e5c[0];
  local_c18 = local_e58._M_pi;
  ::soplex::infinity::__tls_init();
  local_d28._8_8_ = 0;
  local_d28._0_8_ = *(double *)(in_FS_OFFSET + -8);
  local_dc8 = -*(double *)(in_FS_OFFSET + -8);
  local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = 0;
  local_e78._0_4_ = 0;
  local_e78._4_4_ = 0;
  local_e78._8_4_ = 0;
  local_e78._12_4_ = 0;
  local_e78._16_4_ = 0;
  local_e78._20_4_ = 0;
  local_e78._24_4_ = 0;
  local_e5c[0] = false;
  uStack_dc0 = 0x8000000000000000;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&ptr,local_dc8);
  if ((((fpclass_type)local_a48 == cpp_dec_float_NaN) ||
      ((fpclass_type)local_e58._M_pi == cpp_dec_float_NaN)) ||
     (iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         ((cpp_dec_float<50U,_int,_void> *)local_a78,
                          (cpp_dec_float<50U,_int,_void> *)&ptr), 0 < iVar54)) {
LAB_002f8d3d:
    ::soplex::infinity::__tls_init();
    local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._4_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._4_4_ = 0;
    local_e78._0_4_ = 0;
    local_e78._4_4_ = 0;
    local_e78._8_4_ = 0;
    local_e78._12_4_ = 0;
    local_e78._16_4_ = 0;
    local_e78._20_4_ = 0;
    local_e78._24_4_ = 0;
    local_e5c[0] = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&ptr,local_dc8);
    if ((((fpclass_type)local_bd8 == cpp_dec_float_NaN) ||
        ((fpclass_type)local_e58._M_pi == cpp_dec_float_NaN)) ||
       (iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           ((cpp_dec_float<50U,_int,_void> *)local_c08,
                            (cpp_dec_float<50U,_int,_void> *)&ptr), 0 < iVar54)) {
LAB_002f8d9c:
      local_2f8._32_8_ = local_a78._32_8_;
      local_2f8._29_3_ = local_a78._29_3_;
      local_2f8._24_5_ = local_a78._24_5_;
      local_2f8._16_8_ = local_a78._16_8_;
      local_2f8._0_8_ = local_a78._0_8_;
      local_2f8._8_8_ = local_a78._8_8_;
      local_2f8._40_4_ = local_a78._40_4_;
      local_2f8[0x2c] = local_a78[0x2c];
      local_2f8._48_8_ = local_a48;
      local_338.m_backend.data._M_elems[0] = local_b78.data._M_elems[0];
      local_338.m_backend.data._M_elems[1] = local_b78.data._M_elems[1];
      local_338.m_backend.data._M_elems[2] = local_b78.data._M_elems[2];
      local_338.m_backend.data._M_elems[3] = local_b78.data._M_elems[3];
      local_338.m_backend.data._M_elems[4] = local_b78.data._M_elems[4];
      local_338.m_backend.data._M_elems[5] = local_b78.data._M_elems[5];
      local_338.m_backend.data._M_elems[6] = local_b78.data._M_elems[6];
      local_338.m_backend.data._M_elems[7] = local_b78.data._M_elems[7];
      local_338.m_backend.data._M_elems[8] = local_b78.data._M_elems[8];
      local_338.m_backend.data._M_elems[9] = local_b78.data._M_elems[9];
      local_338.m_backend.exp = local_b78.exp;
      local_338.m_backend.neg = local_b78.neg;
      local_338.m_backend.fpclass = local_b78.fpclass;
      local_338.m_backend.prec_elem = local_b78.prec_elem;
      pTVar16 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      p_Var17 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
        }
      }
      RVar68 = Tolerances::epsilon(pTVar16);
      bVar52 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_2f8,&local_338,RVar68);
      if (bVar52) {
        local_378._32_8_ = local_ab8._32_8_;
        local_378._29_3_ = local_ab8._29_3_;
        local_378._24_5_ = local_ab8._24_5_;
        local_378._16_8_ = local_ab8._16_8_;
        local_378._0_8_ = local_ab8._0_8_;
        local_378._8_8_ = local_ab8._8_8_;
        local_378._40_4_ = local_ab8._40_4_;
        local_378[0x2c] = local_ab8[0x2c];
        local_378._48_8_ = local_a88;
        local_3b8.m_backend.data._M_elems[0] = local_bb8.data._M_elems[0];
        local_3b8.m_backend.data._M_elems[1] = local_bb8.data._M_elems[1];
        local_3b8.m_backend.data._M_elems[2] = local_bb8.data._M_elems[2];
        local_3b8.m_backend.data._M_elems[3] = local_bb8.data._M_elems[3];
        local_3b8.m_backend.data._M_elems[4] = local_bb8.data._M_elems[4];
        local_3b8.m_backend.data._M_elems[5] = local_bb8.data._M_elems[5];
        local_3b8.m_backend.data._M_elems[6] = local_bb8.data._M_elems[6];
        local_3b8.m_backend.data._M_elems[7] = local_bb8.data._M_elems[7];
        local_3b8.m_backend.data._M_elems[8] = local_bb8.data._M_elems[8];
        local_3b8.m_backend.data._M_elems[9] = local_bb8.data._M_elems[9];
        local_3b8.m_backend.exp = local_bb8.exp;
        local_3b8.m_backend.neg = local_bb8.neg;
        local_3b8.m_backend.fpclass = local_bb8.fpclass;
        local_3b8.m_backend.prec_elem = local_bb8.prec_elem;
        pTVar16 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        this_01 = (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)(this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
        if (this_01 !=
            (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ppcVar2 = &(this_01->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).m_name;
            *(int *)ppcVar2 = *(int *)ppcVar2 + 1;
            UNLOCK();
          }
          else {
            ppcVar2 = &(this_01->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).m_name;
            *(int *)ppcVar2 = *(int *)ppcVar2 + 1;
          }
        }
        RVar68 = Tolerances::epsilon(pTVar16);
        bVar53 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)local_378,&local_3b8,RVar68);
      }
      else {
        bVar53 = false;
        this_01 = this;
      }
      if (bVar52 && this_01 !=
                    (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
      }
      if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
      }
      if (bVar53 == false) {
        local_4f8._32_8_ = local_c08._32_8_;
        local_4f8._29_3_ = local_c08._29_3_;
        local_4f8._24_5_ = local_c08._24_5_;
        local_4f8._16_8_ = local_c08._16_8_;
        local_4f8._0_8_ = local_c08._0_8_;
        local_4f8._8_8_ = local_c08._8_8_;
        local_4f8._40_4_ = local_c08._40_4_;
        local_4f8[0x2c] = local_c08[0x2c];
        local_4f8._48_8_ = local_bd8;
        local_538.m_backend.data._M_elems[0] = local_c88.data._M_elems[0];
        local_538.m_backend.data._M_elems[1] = local_c88.data._M_elems[1];
        local_538.m_backend.data._M_elems[2] = local_c88.data._M_elems[2];
        local_538.m_backend.data._M_elems[3] = local_c88.data._M_elems[3];
        local_538.m_backend.data._M_elems[4] = local_c88.data._M_elems[4];
        local_538.m_backend.data._M_elems[5] = local_c88.data._M_elems[5];
        local_538.m_backend.data._M_elems[6] = local_c88.data._M_elems[6];
        local_538.m_backend.data._M_elems[7] = local_c88.data._M_elems[7];
        local_538.m_backend.data._M_elems[8] = local_c88.data._M_elems[8];
        local_538.m_backend.data._M_elems[9] = local_c88.data._M_elems[9];
        local_538.m_backend.exp = local_c88.exp;
        local_538.m_backend.neg = local_c88.neg;
        local_538.m_backend.fpclass = local_c88.fpclass;
        local_538.m_backend.prec_elem = local_c88.prec_elem;
        pTVar16 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        p_Var17 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
          }
        }
        RVar68 = Tolerances::epsilon(pTVar16);
        bVar52 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)local_4f8,&local_538,RVar68);
        if (bVar52) {
          local_578._32_8_ = local_c48._32_8_;
          local_578._29_3_ = local_c48._29_3_;
          local_578._24_5_ = local_c48._24_5_;
          local_578._16_8_ = local_c48._16_8_;
          local_578._0_8_ = local_c48._0_8_;
          local_578._8_8_ = local_c48._8_8_;
          local_578._40_4_ = local_c48._40_4_;
          local_578[0x2c] = local_c48[0x2c];
          local_578._48_8_ = local_c18;
          local_5b8.m_backend.data._M_elems[0] = local_cc8.data._M_elems[0];
          local_5b8.m_backend.data._M_elems[1] = local_cc8.data._M_elems[1];
          local_5b8.m_backend.data._M_elems[2] = local_cc8.data._M_elems[2];
          local_5b8.m_backend.data._M_elems[3] = local_cc8.data._M_elems[3];
          local_5b8.m_backend.data._M_elems[4] = local_cc8.data._M_elems[4];
          local_5b8.m_backend.data._M_elems[5] = local_cc8.data._M_elems[5];
          local_5b8.m_backend.data._M_elems[6] = local_cc8.data._M_elems[6];
          local_5b8.m_backend.data._M_elems[7] = local_cc8.data._M_elems[7];
          local_5b8.m_backend.data._M_elems[8] = local_cc8.data._M_elems[8];
          local_5b8.m_backend.data._M_elems[9] = local_cc8.data._M_elems[9];
          local_5b8.m_backend.exp = local_cc8.exp;
          local_5b8.m_backend.neg = local_cc8.neg;
          local_5b8.m_backend.fpclass = local_cc8.fpclass;
          local_5b8.m_backend.prec_elem = local_cc8.prec_elem;
          pTVar16 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          this_01 = (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)(this->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
          if (this_01 !=
              (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ppcVar2 = &(this_01->
                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).m_name;
              *(int *)ppcVar2 = *(int *)ppcVar2 + 1;
              UNLOCK();
            }
            else {
              ppcVar2 = &(this_01->
                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).m_name;
              *(int *)ppcVar2 = *(int *)ppcVar2 + 1;
            }
          }
          RVar68 = Tolerances::epsilon(pTVar16);
          bVar53 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)local_578,&local_5b8,RVar68);
        }
        else {
          bVar53 = false;
        }
        if (bVar52 && this_01 !=
                      (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
        }
        if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
        }
        if (bVar53 != false) goto LAB_002f975f;
        local_e78._16_4_ = (undefined4)local_e08._32_8_;
        local_e78._20_4_ = SUB84(local_e08._32_8_,4);
        local_e78._0_4_ = (undefined4)local_e08._16_8_;
        local_e78._4_4_ = SUB84(local_e08._16_8_,4);
        local_e78._8_4_ = (undefined4)local_e08._24_8_;
        local_e78._12_4_ = SUB84(local_e08._24_8_,4);
        ptr.
        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr._0_4_ = (uint)local_e08._0_8_;
        ptr.
        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr._4_4_ = SUB84(local_e08._0_8_,4);
        ptr.
        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi._0_4_ = (uint)local_e08._8_8_;
        ptr.
        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi._4_4_ = SUB84(local_e08._8_8_,4);
        local_e5c[0] = local_e08[0x2c];
        if ((local_e08[0x2c] == true) &&
           ((uint)ptr.
                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr != 0 || (fpclass_type)local_e08._48_8_ != cpp_dec_float_finite)) {
          local_e5c[0] = false;
        }
        result_2.m_backend.data._M_elems._32_5_ = SUB85(local_db8._32_8_,0);
        result_2.m_backend.data._M_elems[9]._1_3_ = SUB83(local_db8._32_8_,5);
        result_2.m_backend.data._M_elems[4] = local_db8._16_4_;
        result_2.m_backend.data._M_elems[5] = local_db8._20_4_;
        result_2.m_backend.data._M_elems._24_5_ = SUB85(local_db8._24_8_,0);
        result_2.m_backend.data._M_elems[7]._1_3_ = SUB83(local_db8._24_8_,5);
        result_2.m_backend.data._M_elems[0] = local_db8._0_4_;
        result_2.m_backend.data._M_elems[1] = local_db8._4_4_;
        uVar14 = result_2.m_backend.data._M_elems._0_8_;
        result_2.m_backend.data._M_elems[2] = local_db8._8_4_;
        result_2.m_backend.data._M_elems[3] = local_db8._12_4_;
        result_2.m_backend.exp = local_db8._40_4_;
        result_2.m_backend.neg = local_db8[0x2c];
        result_2.m_backend.fpclass = local_db8._48_4_;
        result_2.m_backend.prec_elem = local_db8._52_4_;
        if ((local_db8[0x2c] == true) &&
           (result_2.m_backend.data._M_elems[0] = (uint)local_db8._0_8_,
           result_2.m_backend.data._M_elems[0] != 0 ||
           (fpclass_type)local_db8._48_8_ != cpp_dec_float_finite)) {
          result_2.m_backend.neg = false;
        }
        bVar52 = true;
        result_2.m_backend.data._M_elems._0_8_ = uVar14;
        if ((fpclass_type)local_db8._48_8_ != cpp_dec_float_NaN &&
            (fpclass_type)local_e08._48_8_ != cpp_dec_float_NaN) goto LAB_002f9745;
      }
      else {
        local_3f8._32_8_ = local_c08._32_8_;
        local_3f8._29_3_ = local_c08._29_3_;
        local_3f8._24_5_ = local_c08._24_5_;
        local_3f8._16_8_ = local_c08._16_8_;
        local_3f8._0_8_ = local_c08._0_8_;
        local_3f8._8_8_ = local_c08._8_8_;
        local_3f8._40_4_ = local_c08._40_4_;
        local_3f8[0x2c] = local_c08[0x2c];
        local_3f8._48_8_ = local_bd8;
        local_438.m_backend.data._M_elems[0] = local_c88.data._M_elems[0];
        local_438.m_backend.data._M_elems[1] = local_c88.data._M_elems[1];
        local_438.m_backend.data._M_elems[2] = local_c88.data._M_elems[2];
        local_438.m_backend.data._M_elems[3] = local_c88.data._M_elems[3];
        local_438.m_backend.data._M_elems[4] = local_c88.data._M_elems[4];
        local_438.m_backend.data._M_elems[5] = local_c88.data._M_elems[5];
        local_438.m_backend.data._M_elems[6] = local_c88.data._M_elems[6];
        local_438.m_backend.data._M_elems[7] = local_c88.data._M_elems[7];
        local_438.m_backend.data._M_elems[8] = local_c88.data._M_elems[8];
        local_438.m_backend.data._M_elems[9] = local_c88.data._M_elems[9];
        local_438.m_backend.exp = local_c88.exp;
        local_438.m_backend.neg = local_c88.neg;
        local_438.m_backend.fpclass = local_c88.fpclass;
        local_438.m_backend.prec_elem = local_c88.prec_elem;
        pTVar16 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        p_Var17 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
          }
        }
        RVar68 = Tolerances::epsilon(pTVar16);
        bVar52 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)local_3f8,&local_438,RVar68);
        if (bVar52) {
          local_478._32_8_ = local_c48._32_8_;
          local_478._29_3_ = local_c48._29_3_;
          local_478._24_5_ = local_c48._24_5_;
          local_478._16_8_ = local_c48._16_8_;
          local_478._0_8_ = local_c48._0_8_;
          local_478._8_8_ = local_c48._8_8_;
          local_478._40_4_ = local_c48._40_4_;
          local_478[0x2c] = local_c48[0x2c];
          local_478._48_8_ = local_c18;
          local_4b8.m_backend.data._M_elems[0] = local_cc8.data._M_elems[0];
          local_4b8.m_backend.data._M_elems[1] = local_cc8.data._M_elems[1];
          local_4b8.m_backend.data._M_elems[2] = local_cc8.data._M_elems[2];
          local_4b8.m_backend.data._M_elems[3] = local_cc8.data._M_elems[3];
          local_4b8.m_backend.data._M_elems[4] = local_cc8.data._M_elems[4];
          local_4b8.m_backend.data._M_elems[5] = local_cc8.data._M_elems[5];
          local_4b8.m_backend.data._M_elems[6] = local_cc8.data._M_elems[6];
          local_4b8.m_backend.data._M_elems[7] = local_cc8.data._M_elems[7];
          local_4b8.m_backend.data._M_elems[8] = local_cc8.data._M_elems[8];
          local_4b8.m_backend.data._M_elems[9] = local_cc8.data._M_elems[9];
          local_4b8.m_backend.exp = local_cc8.exp;
          local_4b8.m_backend.neg = local_cc8.neg;
          local_4b8.m_backend.fpclass = local_cc8.fpclass;
          local_4b8.m_backend.prec_elem = local_cc8.prec_elem;
          pTVar16 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          this_01 = (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)(this->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
          if (this_01 !=
              (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ppcVar2 = &(this_01->
                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).m_name;
              *(int *)ppcVar2 = *(int *)ppcVar2 + 1;
              UNLOCK();
            }
            else {
              ppcVar2 = &(this_01->
                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).m_name;
              *(int *)ppcVar2 = *(int *)ppcVar2 + 1;
            }
          }
          RVar68 = Tolerances::epsilon(pTVar16);
          bVar53 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)local_478,&local_4b8,RVar68);
        }
        else {
          bVar53 = false;
        }
        if (bVar52 && this_01 !=
                      (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
        }
        if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
        }
        if (bVar53 == false) goto LAB_002f9a13;
        local_e78._16_4_ = (undefined4)local_e08._32_8_;
        local_e78._20_4_ = SUB84(local_e08._32_8_,4);
        local_e78._0_4_ = (undefined4)local_e08._16_8_;
        local_e78._4_4_ = SUB84(local_e08._16_8_,4);
        local_e78._8_4_ = (undefined4)local_e08._24_8_;
        local_e78._12_4_ = SUB84(local_e08._24_8_,4);
        ptr.
        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr._0_4_ = (uint)local_e08._0_8_;
        ptr.
        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr._4_4_ = SUB84(local_e08._0_8_,4);
        ptr.
        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi._0_4_ = (uint)local_e08._8_8_;
        ptr.
        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi._4_4_ = SUB84(local_e08._8_8_,4);
        local_e5c[0] = local_e08[0x2c];
        if ((local_e08[0x2c] == true) &&
           ((uint)ptr.
                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr != 0 || (fpclass_type)local_e08._48_8_ != cpp_dec_float_finite)) {
          local_e5c[0] = false;
        }
        result_2.m_backend.data._M_elems._32_5_ = SUB85(local_db8._32_8_,0);
        result_2.m_backend.data._M_elems[9]._1_3_ = SUB83(local_db8._32_8_,5);
        result_2.m_backend.data._M_elems[4] = local_db8._16_4_;
        result_2.m_backend.data._M_elems[5] = local_db8._20_4_;
        result_2.m_backend.data._M_elems._24_5_ = SUB85(local_db8._24_8_,0);
        result_2.m_backend.data._M_elems[7]._1_3_ = SUB83(local_db8._24_8_,5);
        result_2.m_backend.data._M_elems[0] = local_db8._0_4_;
        result_2.m_backend.data._M_elems[1] = local_db8._4_4_;
        uVar14 = result_2.m_backend.data._M_elems._0_8_;
        result_2.m_backend.data._M_elems[2] = local_db8._8_4_;
        result_2.m_backend.data._M_elems[3] = local_db8._12_4_;
        result_2.m_backend.exp = local_db8._40_4_;
        result_2.m_backend.neg = local_db8[0x2c];
        result_2.m_backend.fpclass = local_db8._48_4_;
        result_2.m_backend.prec_elem = local_db8._52_4_;
        if ((local_db8[0x2c] == true) &&
           (result_2.m_backend.data._M_elems[0] = (uint)local_db8._0_8_,
           result_2.m_backend.data._M_elems[0] != 0 ||
           (fpclass_type)local_db8._48_8_ != cpp_dec_float_finite)) {
          result_2.m_backend.neg = false;
        }
        bVar52 = true;
        result_2.m_backend.data._M_elems._0_8_ = uVar14;
        if ((fpclass_type)local_db8._48_8_ != cpp_dec_float_NaN &&
            (fpclass_type)local_e08._48_8_ != cpp_dec_float_NaN) {
LAB_002f9745:
          local_e78._24_4_ = local_e08._40_4_;
          local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e08._48_8_;
          result_2.m_backend.data._M_elems._16_8_ = local_db8._16_8_;
          result_2.m_backend.exp = local_db8._40_4_;
          result_2.m_backend._48_8_ = local_db8._48_8_;
          result_2.m_backend.data._M_elems._0_8_ = local_db8._0_8_;
          result_2.m_backend.data._M_elems._8_8_ = local_db8._8_8_;
          iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)&ptr,&result_2.m_backend);
          bVar52 = iVar54 < 1;
        }
      }
      if (bVar52) goto LAB_002f975f;
    }
    else {
      ::soplex::infinity::__tls_init();
      result_2.m_backend.fpclass = cpp_dec_float_finite;
      result_2.m_backend.prec_elem = 10;
      result_2.m_backend.data._M_elems[0] = 0;
      result_2.m_backend.data._M_elems[1] = 0;
      result_2.m_backend.data._M_elems[2] = 0;
      result_2.m_backend.data._M_elems[3] = 0;
      result_2.m_backend.data._M_elems[4] = 0;
      result_2.m_backend.data._M_elems[5] = 0;
      result_2.m_backend.data._M_elems._24_5_ = 0;
      result_2.m_backend.data._M_elems[7]._1_3_ = 0;
      result_2.m_backend.data._M_elems._32_5_ = 0;
      result_2.m_backend.data._M_elems[9]._1_3_ = 0;
      result_2.m_backend.exp = 0;
      result_2.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&result_2,(double)local_d28._0_8_);
      if ((((fpclass_type)local_c18 == cpp_dec_float_NaN) ||
          (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
         (iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)local_c48,&result_2.m_backend),
         iVar54 < 0)) goto LAB_002f8d9c;
    }
LAB_002f9a13:
    iVar54 = (int)local_d10;
    local_d10 = local_d38;
  }
  else {
    ::soplex::infinity::__tls_init();
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems[0] = 0;
    result_2.m_backend.data._M_elems[1] = 0;
    result_2.m_backend.data._M_elems[2] = 0;
    result_2.m_backend.data._M_elems[3] = 0;
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems._24_5_ = 0;
    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_2,(double)local_d28._0_8_);
    if ((((fpclass_type)local_a88 == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           ((cpp_dec_float<50U,_int,_void> *)local_ab8,&result_2.m_backend),
       iVar54 < 0)) goto LAB_002f8d3d;
LAB_002f975f:
    uVar51 = local_b78._48_8_;
    bVar50 = local_b78.neg;
    iVar10 = local_b78.exp;
    uVar48 = local_b78.data._M_elems._32_8_;
    uVar46 = local_b78.data._M_elems._24_8_;
    uVar44 = local_b78.data._M_elems._16_8_;
    uVar42 = local_b78.data._M_elems._8_8_;
    uVar40 = local_b78.data._M_elems._0_8_;
    uVar39 = local_bb8._48_8_;
    bVar53 = local_bb8.neg;
    iVar54 = local_bb8.exp;
    uVar38 = local_bb8.data._M_elems._32_8_;
    uVar37 = local_bb8.data._M_elems._24_8_;
    uVar36 = local_bb8.data._M_elems._16_8_;
    uVar35 = local_bb8.data._M_elems._8_8_;
    uVar34 = local_bb8.data._M_elems._0_8_;
    uVar33 = local_e08._48_8_;
    bVar52 = local_e08[0x2c];
    uVar30 = local_e08._40_4_;
    uVar26 = local_e08._32_8_;
    uVar20 = local_e08._24_8_;
    uVar23 = local_e08._16_8_;
    uVar21 = local_e08._8_8_;
    uVar14 = local_e08._0_8_;
    result_2.m_backend.data._M_elems._32_5_ = local_b78.data._M_elems._32_5_;
    result_2.m_backend.data._M_elems[9]._1_3_ = local_b78.data._M_elems[9]._1_3_;
    result_2.m_backend.data._M_elems[4] = local_b78.data._M_elems[4];
    result_2.m_backend.data._M_elems[5] = local_b78.data._M_elems[5];
    result_2.m_backend.data._M_elems._24_5_ = local_b78.data._M_elems._24_5_;
    result_2.m_backend.data._M_elems[7]._1_3_ = local_b78.data._M_elems[7]._1_3_;
    result_2.m_backend.data._M_elems[0] = local_b78.data._M_elems[0];
    result_2.m_backend.data._M_elems[1] = local_b78.data._M_elems[1];
    result_2.m_backend.data._M_elems[2] = local_b78.data._M_elems[2];
    result_2.m_backend.data._M_elems[3] = local_b78.data._M_elems[3];
    aggr_const.m_backend.data._M_elems._32_5_ = local_bb8.data._M_elems._32_5_;
    aggr_const.m_backend.data._M_elems[9]._1_3_ = local_bb8.data._M_elems[9]._1_3_;
    aggr_const.m_backend.data._M_elems[4] = local_bb8.data._M_elems[4];
    aggr_const.m_backend.data._M_elems[5] = local_bb8.data._M_elems[5];
    aggr_const.m_backend.data._M_elems._24_5_ = local_bb8.data._M_elems._24_5_;
    aggr_const.m_backend.data._M_elems[7]._1_3_ = local_bb8.data._M_elems[7]._1_3_;
    aggr_const.m_backend.data._M_elems[0] = local_bb8.data._M_elems[0];
    aggr_const.m_backend.data._M_elems[1] = local_bb8.data._M_elems[1];
    aggr_const.m_backend.data._M_elems[2] = local_bb8.data._M_elems[2];
    aggr_const.m_backend.data._M_elems[3] = local_bb8.data._M_elems[3];
    local_e08._32_8_ = local_db8._32_8_;
    uVar27 = local_e08._32_8_;
    local_e08._16_8_ = local_db8._16_8_;
    uVar24 = local_e08._16_8_;
    local_e08._24_8_ = local_db8._24_8_;
    uVar25 = local_e08._24_8_;
    local_e08._0_8_ = local_db8._0_8_;
    uVar15 = local_e08._0_8_;
    local_e08._8_8_ = local_db8._8_8_;
    uVar22 = local_e08._8_8_;
    local_e08._40_4_ = local_db8._40_4_;
    local_e08[0x2c] = local_db8[0x2c];
    local_e08._32_4_ = (undefined4)uVar26;
    local_e08._36_4_ = SUB84(uVar26,4);
    local_db8._32_4_ = local_e08._32_4_;
    local_db8._36_4_ = local_e08._36_4_;
    local_e08._0_4_ = (undefined4)uVar14;
    local_e08._4_4_ = SUB84(uVar14,4);
    local_db8._0_4_ = local_e08._0_4_;
    local_db8._4_4_ = local_e08._4_4_;
    local_e08._8_4_ = (undefined4)uVar21;
    local_e08._12_4_ = SUB84(uVar21,4);
    local_db8._8_4_ = local_e08._8_4_;
    local_db8._12_4_ = local_e08._12_4_;
    local_e08._16_4_ = (undefined4)uVar23;
    local_e08._20_4_ = SUB84(uVar23,4);
    local_db8._16_4_ = local_e08._16_4_;
    local_db8._20_4_ = local_e08._20_4_;
    local_e08._24_4_ = (undefined4)uVar20;
    local_e08._28_4_ = SUB84(uVar20,4);
    local_db8._24_4_ = local_e08._24_4_;
    local_db8._28_4_ = local_e08._28_4_;
    local_db8._40_4_ = uVar30;
    local_db8[0x2c] = bVar52;
    local_e08._48_8_ = local_db8._48_8_;
    local_db8._48_8_ = uVar33;
    local_b78.data._M_elems[8] = local_c88.data._M_elems[8];
    local_b78.data._M_elems[9] = local_c88.data._M_elems[9];
    uVar49 = local_b78.data._M_elems._32_8_;
    local_b78.data._M_elems[4] = local_c88.data._M_elems[4];
    local_b78.data._M_elems[5] = local_c88.data._M_elems[5];
    uVar45 = local_b78.data._M_elems._16_8_;
    local_b78.data._M_elems[6] = local_c88.data._M_elems[6];
    local_b78.data._M_elems[7] = local_c88.data._M_elems[7];
    uVar47 = local_b78.data._M_elems._24_8_;
    local_b78.data._M_elems[0] = local_c88.data._M_elems[0];
    local_b78.data._M_elems[1] = local_c88.data._M_elems[1];
    uVar41 = local_b78.data._M_elems._0_8_;
    local_b78.data._M_elems[2] = local_c88.data._M_elems[2];
    local_b78.data._M_elems[3] = local_c88.data._M_elems[3];
    uVar43 = local_b78.data._M_elems._8_8_;
    local_b78.exp = local_c88.exp;
    local_b78.neg = local_c88.neg;
    local_b78.data._M_elems[8] = (uint)uVar48;
    local_b78.data._M_elems[9] = SUB84(uVar48,4);
    local_c88.data._M_elems[8] = local_b78.data._M_elems[8];
    local_c88.data._M_elems[9] = local_b78.data._M_elems[9];
    local_b78.data._M_elems[6] = (uint)uVar46;
    local_b78.data._M_elems[7] = SUB84(uVar46,4);
    local_c88.data._M_elems[6] = local_b78.data._M_elems[6];
    local_c88.data._M_elems[7] = local_b78.data._M_elems[7];
    local_b78.data._M_elems[4] = (uint)uVar44;
    local_b78.data._M_elems[5] = SUB84(uVar44,4);
    local_c88.data._M_elems[4] = local_b78.data._M_elems[4];
    local_c88.data._M_elems[5] = local_b78.data._M_elems[5];
    local_b78.data._M_elems[0] = (uint)uVar40;
    local_b78.data._M_elems[1] = SUB84(uVar40,4);
    local_c88.data._M_elems[0] = local_b78.data._M_elems[0];
    local_c88.data._M_elems[1] = local_b78.data._M_elems[1];
    local_b78.data._M_elems[2] = (uint)uVar42;
    local_b78.data._M_elems[3] = SUB84(uVar42,4);
    local_c88.data._M_elems[2] = local_b78.data._M_elems[2];
    local_c88.data._M_elems[3] = local_b78.data._M_elems[3];
    local_c88.exp = iVar10;
    local_c88.neg = bVar50;
    local_b78.fpclass = local_c88.fpclass;
    local_b78.prec_elem = local_c88.prec_elem;
    uVar40 = local_b78._48_8_;
    local_b78.fpclass = (fpclass_type)uVar51;
    local_b78.prec_elem = SUB84(uVar51,4);
    local_c88.fpclass = local_b78.fpclass;
    local_c88.prec_elem = local_b78.prec_elem;
    local_bb8.data._M_elems[8] = local_cc8.data._M_elems[8];
    local_bb8.data._M_elems[9] = local_cc8.data._M_elems[9];
    uVar26 = local_bb8.data._M_elems._32_8_;
    local_bb8.data._M_elems[4] = local_cc8.data._M_elems[4];
    local_bb8.data._M_elems[5] = local_cc8.data._M_elems[5];
    uVar23 = local_bb8.data._M_elems._16_8_;
    local_bb8.data._M_elems[6] = local_cc8.data._M_elems[6];
    local_bb8.data._M_elems[7] = local_cc8.data._M_elems[7];
    uVar20 = local_bb8.data._M_elems._24_8_;
    local_bb8.data._M_elems[0] = local_cc8.data._M_elems[0];
    local_bb8.data._M_elems[1] = local_cc8.data._M_elems[1];
    uVar14 = local_bb8.data._M_elems._0_8_;
    local_bb8.data._M_elems[2] = local_cc8.data._M_elems[2];
    local_bb8.data._M_elems[3] = local_cc8.data._M_elems[3];
    uVar21 = local_bb8.data._M_elems._8_8_;
    local_bb8.exp = local_cc8.exp;
    local_bb8.neg = local_cc8.neg;
    local_bb8.data._M_elems[8] = (uint)uVar38;
    local_bb8.data._M_elems[9] = SUB84(uVar38,4);
    local_cc8.data._M_elems[8] = local_bb8.data._M_elems[8];
    local_cc8.data._M_elems[9] = local_bb8.data._M_elems[9];
    local_bb8.data._M_elems[6] = (uint)uVar37;
    local_bb8.data._M_elems[7] = SUB84(uVar37,4);
    local_cc8.data._M_elems[6] = local_bb8.data._M_elems[6];
    local_cc8.data._M_elems[7] = local_bb8.data._M_elems[7];
    local_bb8.data._M_elems[4] = (uint)uVar36;
    local_bb8.data._M_elems[5] = SUB84(uVar36,4);
    local_cc8.data._M_elems[4] = local_bb8.data._M_elems[4];
    local_cc8.data._M_elems[5] = local_bb8.data._M_elems[5];
    local_bb8.data._M_elems[0] = (uint)uVar34;
    local_bb8.data._M_elems[1] = SUB84(uVar34,4);
    local_cc8.data._M_elems[0] = local_bb8.data._M_elems[0];
    local_cc8.data._M_elems[1] = local_bb8.data._M_elems[1];
    local_bb8.data._M_elems[2] = (uint)uVar35;
    local_bb8.data._M_elems[3] = SUB84(uVar35,4);
    local_cc8.data._M_elems[2] = local_bb8.data._M_elems[2];
    local_cc8.data._M_elems[3] = local_bb8.data._M_elems[3];
    local_cc8.exp = iVar54;
    local_cc8.neg = bVar53;
    local_bb8.fpclass = local_cc8.fpclass;
    local_bb8.prec_elem = local_cc8.prec_elem;
    uVar33 = local_bb8._48_8_;
    local_bb8.fpclass = (fpclass_type)uVar39;
    local_bb8.prec_elem = SUB84(uVar39,4);
    local_cc8.fpclass = local_bb8.fpclass;
    local_cc8.prec_elem = local_bb8.prec_elem;
    iVar54 = (int)local_d38;
    local_e08._0_8_ = uVar15;
    local_e08._8_8_ = uVar22;
    local_e08._16_8_ = uVar24;
    local_e08._24_8_ = uVar25;
    local_e08._32_8_ = uVar27;
    local_bb8.data._M_elems._0_8_ = uVar14;
    local_bb8.data._M_elems._8_8_ = uVar21;
    local_bb8.data._M_elems._16_8_ = uVar23;
    local_bb8.data._M_elems._24_8_ = uVar20;
    local_bb8.data._M_elems._32_8_ = uVar26;
    local_bb8._48_8_ = uVar33;
    local_b78.data._M_elems._0_8_ = uVar41;
    local_b78.data._M_elems._8_8_ = uVar43;
    local_b78.data._M_elems._16_8_ = uVar45;
    local_b78.data._M_elems._24_8_ = uVar47;
    local_b78.data._M_elems._32_8_ = uVar49;
    local_b78._48_8_ = uVar40;
  }
  pIVar18 = (pSVar66->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem;
  pDVar19 = (pSVar66->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thekey;
  local_920 = (long)(int)local_d10;
  iVar10 = pDVar19[local_920].idx;
  local_d38 = CONCAT44(local_d38._4_4_,iVar54);
  iVar54 = pDVar19[iVar54].idx;
  local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = 0;
  local_e78._0_4_ = 0;
  local_e78._4_4_ = 0;
  local_e78._8_4_ = 0;
  local_e78._12_4_ = 0;
  local_e78._16_4_ = 0;
  local_e78._20_4_ = 0;
  local_e78._24_4_ = 0;
  local_e5c[0] = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            ((cpp_dec_float<50U,_int,_void> *)&ptr,(cpp_dec_float<50U,_int,_void> *)local_db8,
             (cpp_dec_float<50U,_int,_void> *)local_e08);
  uVar30 = local_e78._24_4_;
  local_948 = CONCAT44((uint)ptr.
                             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi,
                       ptr.
                       super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr._4_4_);
  uStack_940 = CONCAT44(local_e78._0_4_,
                        ptr.
                        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi._4_4_);
  local_938 = CONCAT44(local_e78._8_4_,local_e78._4_4_);
  uStack_930 = CONCAT44(local_e78._16_4_,local_e78._12_4_);
  local_928 = local_e78._20_4_;
  local_d30 = local_e58._M_pi._4_4_;
  local_bc8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT44(local_bc8._4_4_,
                       (uint)ptr.
                             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
  local_d2c = (fpclass_type)local_e58._M_pi;
  local_e49 = ((uint)ptr.
                     super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr != 0 || (fpclass_type)local_e58._M_pi != cpp_dec_float_finite) ^
              local_e5c[0];
  aggr_const.m_backend.fpclass = cpp_dec_float_finite;
  aggr_const.m_backend.prec_elem = 10;
  aggr_const.m_backend.data._M_elems[0] = 0;
  aggr_const.m_backend.data._M_elems[1] = 0;
  aggr_const.m_backend.data._M_elems[2] = 0;
  aggr_const.m_backend.data._M_elems[3] = 0;
  aggr_const.m_backend.data._M_elems[4] = 0;
  aggr_const.m_backend.data._M_elems[5] = 0;
  aggr_const.m_backend.data._M_elems._24_5_ = 0;
  aggr_const.m_backend.data._M_elems[7]._1_3_ = 0;
  aggr_const.m_backend.data._M_elems._32_5_ = 0;
  aggr_const.m_backend.data._M_elems[9]._1_3_ = 0;
  aggr_const.m_backend.exp = 0;
  aggr_const.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&aggr_const.m_backend,(cpp_dec_float<50U,_int,_void> *)local_d78,
             (cpp_dec_float<50U,_int,_void> *)local_e08);
  if (0 < pIVar18[iVar10].data.
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    pIVar1 = pIVar18 + iVar10;
    pIVar18 = pIVar18 + iVar54;
    lVar64 = 0;
    do {
      uVar63 = (pIVar1->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem[lVar64].idx;
      pNVar12 = (pIVar1->data).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem;
      uVar14 = *(undefined8 *)(pNVar12[lVar64].val.m_backend.data._M_elems + 8);
      local_e78._16_4_ = (undefined4)uVar14;
      local_e78._20_4_ = (undefined4)((ulong)uVar14 >> 0x20);
      uVar14 = *(undefined8 *)&pNVar12[lVar64].val.m_backend.data;
      uVar15 = *(undefined8 *)(pNVar12[lVar64].val.m_backend.data._M_elems + 2);
      puVar3 = pNVar12[lVar64].val.m_backend.data._M_elems + 4;
      uVar21 = *(undefined8 *)puVar3;
      uVar22 = *(undefined8 *)(puVar3 + 2);
      local_e78._0_4_ = (undefined4)uVar21;
      local_e78._4_4_ = (undefined4)((ulong)uVar21 >> 0x20);
      local_e78._8_4_ = (undefined4)uVar22;
      local_e78._12_4_ = (undefined4)((ulong)uVar22 >> 0x20);
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = (uint)uVar14;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = (uint)((ulong)uVar14 >> 0x20);
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = (uint)uVar15;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = (uint)((ulong)uVar15 >> 0x20);
      local_e78._24_4_ = pNVar12[lVar64].val.m_backend.exp;
      local_e5c[0] = pNVar12[lVar64].val.m_backend.neg;
      local_e58._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&pNVar12[lVar64].val.m_backend.fpclass;
      if (uVar63 != *i) {
        pnVar11 = (local_dd0->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).left.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar14 = *(undefined8 *)(pnVar11[(int)uVar63].m_backend.data._M_elems + 8);
        result_2.m_backend.data._M_elems._32_5_ = SUB85(uVar14,0);
        result_2.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
        result_2.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar11[(int)uVar63].m_backend.data
        ;
        result_2.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar11[(int)uVar63].m_backend.data._M_elems + 2);
        puVar3 = pnVar11[(int)uVar63].m_backend.data._M_elems + 4;
        result_2.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
        uVar14 = *(undefined8 *)(puVar3 + 2);
        result_2.m_backend.data._M_elems._24_5_ = SUB85(uVar14,0);
        result_2.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
        result_2.m_backend.exp = pnVar11[(int)uVar63].m_backend.exp;
        result_2.m_backend.neg = pnVar11[(int)uVar63].m_backend.neg;
        result_2.m_backend.fpclass = pnVar11[(int)uVar63].m_backend.fpclass;
        result_2.m_backend.prec_elem = pnVar11[(int)uVar63].m_backend.prec_elem;
        pnVar11 = (local_dd0->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        obj_j.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar11[(int)uVar63].m_backend.data._M_elems + 8);
        obj_j.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar11[(int)uVar63].m_backend.data;
        obj_j.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar11[(int)uVar63].m_backend.data._M_elems + 2);
        puVar3 = pnVar11[(int)uVar63].m_backend.data._M_elems + 4;
        obj_j.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
        obj_j.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
        obj_j.m_backend.exp = pnVar11[(int)uVar63].m_backend.exp;
        obj_j.m_backend.neg = pnVar11[(int)uVar63].m_backend.neg;
        obj_j.m_backend.fpclass = pnVar11[(int)uVar63].m_backend.fpclass;
        obj_j.m_backend.prec_elem = pnVar11[(int)uVar63].m_backend.prec_elem;
        ::soplex::infinity::__tls_init();
        result_30.m_backend.fpclass = cpp_dec_float_finite;
        result_30.m_backend.prec_elem = 10;
        result_30.m_backend.data._M_elems[0] = 0;
        result_30.m_backend.data._M_elems[1] = 0;
        result_30.m_backend.data._M_elems[2] = 0;
        result_30.m_backend.data._M_elems[3] = 0;
        result_30.m_backend.data._M_elems[4] = 0;
        result_30.m_backend.data._M_elems[5] = 0;
        result_30.m_backend.data._M_elems[6] = 0;
        result_30.m_backend.data._M_elems[7] = 0;
        result_30.m_backend.data._M_elems[8] = 0;
        result_30.m_backend.data._M_elems[9] = 0;
        result_30.m_backend.exp = 0;
        result_30.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&result_30.m_backend,local_dc8);
        if (((result_2.m_backend.fpclass != cpp_dec_float_NaN) &&
            (result_30.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&result_2.m_backend,&result_30.m_backend), 0 < iVar54)) {
          result_29.m_backend.data._M_elems[9]._1_3_ = aggr_const.m_backend.data._M_elems[9]._1_3_;
          result_29.m_backend.data._M_elems._32_5_ = aggr_const.m_backend.data._M_elems._32_5_;
          result_29.m_backend.data._M_elems[7]._1_3_ = aggr_const.m_backend.data._M_elems[7]._1_3_;
          result_29.m_backend.data._M_elems._24_5_ = aggr_const.m_backend.data._M_elems._24_5_;
          result_29.m_backend.data._M_elems[4] = aggr_const.m_backend.data._M_elems[4];
          result_29.m_backend.data._M_elems[5] = aggr_const.m_backend.data._M_elems[5];
          result_29.m_backend.data._M_elems[0] = aggr_const.m_backend.data._M_elems[0];
          result_29.m_backend.data._M_elems[1] = aggr_const.m_backend.data._M_elems[1];
          result_29.m_backend.data._M_elems[2] = aggr_const.m_backend.data._M_elems[2];
          result_29.m_backend.data._M_elems[3] = aggr_const.m_backend.data._M_elems[3];
          result_29.m_backend.exp = aggr_const.m_backend.exp;
          result_29.m_backend.neg = aggr_const.m_backend.neg;
          result_29.m_backend.fpclass = aggr_const.m_backend.fpclass;
          result_29.m_backend.prec_elem = aggr_const.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&result_29.m_backend,(cpp_dec_float<50U,_int,_void> *)&ptr);
          result_30.m_backend.data._M_elems[8] = result_2.m_backend.data._M_elems[8];
          result_30.m_backend.data._M_elems[9] =
               (uint)(CONCAT35(result_2.m_backend.data._M_elems[9]._1_3_,
                               result_2.m_backend.data._M_elems._32_5_) >> 0x20);
          result_30.m_backend.data._M_elems[4] = result_2.m_backend.data._M_elems[4];
          result_30.m_backend.data._M_elems[5] = result_2.m_backend.data._M_elems[5];
          result_30.m_backend.data._M_elems[6] = result_2.m_backend.data._M_elems[6];
          result_30.m_backend.data._M_elems[7] =
               (uint)(CONCAT35(result_2.m_backend.data._M_elems[7]._1_3_,
                               result_2.m_backend.data._M_elems._24_5_) >> 0x20);
          result_30.m_backend.data._M_elems[0] = result_2.m_backend.data._M_elems[0];
          result_30.m_backend.data._M_elems[1] = result_2.m_backend.data._M_elems[1];
          result_30.m_backend.data._M_elems[2] = result_2.m_backend.data._M_elems[2];
          result_30.m_backend.data._M_elems[3] = result_2.m_backend.data._M_elems[3];
          result_30.m_backend.exp = result_2.m_backend.exp;
          result_30.m_backend.neg = result_2.m_backend.neg;
          result_30.m_backend.fpclass = result_2.m_backend.fpclass;
          result_30.m_backend.prec_elem = result_2.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&result_30.m_backend,&result_29.m_backend);
          (*(local_dd0->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x33])(local_dd0,(ulong)uVar63,&result_30,0);
          piVar59 = &(this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_chgLRhs;
          *piVar59 = *piVar59 + 1;
        }
        ::soplex::infinity::__tls_init();
        result_30.m_backend.fpclass = cpp_dec_float_finite;
        result_30.m_backend.prec_elem = 10;
        result_30.m_backend.data._M_elems[0] = 0;
        result_30.m_backend.data._M_elems[1] = 0;
        result_30.m_backend.data._M_elems[2] = 0;
        result_30.m_backend.data._M_elems[3] = 0;
        result_30.m_backend.data._M_elems[4] = 0;
        result_30.m_backend.data._M_elems[5] = 0;
        result_30.m_backend.data._M_elems[6] = 0;
        result_30.m_backend.data._M_elems[7] = 0;
        result_30.m_backend.data._M_elems[8] = 0;
        result_30.m_backend.data._M_elems[9] = 0;
        result_30.m_backend.exp = 0;
        result_30.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&result_30.m_backend,(double)local_d28._0_8_);
        if (((obj_j.m_backend.fpclass != cpp_dec_float_NaN) &&
            (result_30.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&obj_j.m_backend,&result_30.m_backend), iVar54 < 0)) {
          result_29.m_backend.data._M_elems[9]._1_3_ = aggr_const.m_backend.data._M_elems[9]._1_3_;
          result_29.m_backend.data._M_elems._32_5_ = aggr_const.m_backend.data._M_elems._32_5_;
          result_29.m_backend.data._M_elems[7]._1_3_ = aggr_const.m_backend.data._M_elems[7]._1_3_;
          result_29.m_backend.data._M_elems._24_5_ = aggr_const.m_backend.data._M_elems._24_5_;
          result_29.m_backend.data._M_elems[4] = aggr_const.m_backend.data._M_elems[4];
          result_29.m_backend.data._M_elems[5] = aggr_const.m_backend.data._M_elems[5];
          result_29.m_backend.data._M_elems[0] = aggr_const.m_backend.data._M_elems[0];
          result_29.m_backend.data._M_elems[1] = aggr_const.m_backend.data._M_elems[1];
          result_29.m_backend.data._M_elems[2] = aggr_const.m_backend.data._M_elems[2];
          result_29.m_backend.data._M_elems[3] = aggr_const.m_backend.data._M_elems[3];
          result_29.m_backend.exp = aggr_const.m_backend.exp;
          result_29.m_backend.neg = aggr_const.m_backend.neg;
          result_29.m_backend.fpclass = aggr_const.m_backend.fpclass;
          result_29.m_backend.prec_elem = aggr_const.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&result_29.m_backend,(cpp_dec_float<50U,_int,_void> *)&ptr);
          result_30.m_backend.data._M_elems[8] = obj_j.m_backend.data._M_elems[8];
          result_30.m_backend.data._M_elems[9] = obj_j.m_backend.data._M_elems[9];
          result_30.m_backend.data._M_elems[4] = obj_j.m_backend.data._M_elems[4];
          result_30.m_backend.data._M_elems[5] = obj_j.m_backend.data._M_elems[5];
          result_30.m_backend.data._M_elems[6] = obj_j.m_backend.data._M_elems[6];
          result_30.m_backend.data._M_elems[7] = obj_j.m_backend.data._M_elems[7];
          result_30.m_backend.data._M_elems[0] = obj_j.m_backend.data._M_elems[0];
          result_30.m_backend.data._M_elems[1] = obj_j.m_backend.data._M_elems[1];
          result_30.m_backend.data._M_elems[2] = obj_j.m_backend.data._M_elems[2];
          result_30.m_backend.data._M_elems[3] = obj_j.m_backend.data._M_elems[3];
          result_30.m_backend.exp = obj_j.m_backend.exp;
          result_30.m_backend.neg = obj_j.m_backend.neg;
          result_30.m_backend.fpclass = obj_j.m_backend.fpclass;
          result_30.m_backend.prec_elem = obj_j.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&result_30.m_backend,&result_29.m_backend);
          (*(local_dd0->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x36])(local_dd0,(ulong)uVar63,&result_30,0);
          piVar59 = &(this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_chgLRhs;
          *piVar59 = *piVar59 + 1;
        }
        result_30.m_backend.data._M_elems[0] = (fpclass_type)local_bc8;
        result_30.m_backend.data._M_elems[9] = local_928;
        result_30.m_backend.data._M_elems[5] = (uint)local_938;
        result_30.m_backend.data._M_elems[6] = (uint)((ulong)local_938 >> 0x20);
        result_30.m_backend.data._M_elems[7] = (uint)uStack_930;
        result_30.m_backend.data._M_elems[8] = (uint)((ulong)uStack_930 >> 0x20);
        result_30.m_backend.data._M_elems[1] = (uint)local_948;
        result_30.m_backend.data._M_elems[2] = (uint)((ulong)local_948 >> 0x20);
        result_30.m_backend.data._M_elems[3] = (uint)uStack_940;
        result_30.m_backend.data._M_elems[4] = (uint)((ulong)uStack_940 >> 0x20);
        result_30.m_backend.exp = uVar30;
        result_30.m_backend.neg = (bool)local_e49;
        result_30.m_backend.prec_elem = local_d30;
        result_30.m_backend.fpclass = local_d2c;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&result_30.m_backend,(cpp_dec_float<50U,_int,_void> *)&ptr);
        pNVar12 = (pIVar18->data).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .m_elem;
        if ((pNVar12 ==
             (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)0x0) ||
           (uVar61 = (ulong)(pIVar18->data).
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .memused, (long)uVar61 < 1)) {
LAB_002fa09b:
          uVar55 = 0xffffffff;
        }
        else {
          if (pNVar12->idx == uVar63) {
            bVar52 = true;
            uVar56 = 0;
          }
          else {
            uVar56 = 0;
            piVar59 = &pNVar12[1].idx;
            do {
              if (uVar61 - 1 == uVar56) goto LAB_002fa09b;
              uVar56 = uVar56 + 1;
              uVar55 = *piVar59;
              piVar59 = piVar59 + 0xf;
            } while (uVar55 != uVar63);
            bVar52 = uVar56 < uVar61;
          }
          uVar55 = (uint)uVar56;
          if (!bVar52) goto LAB_002fa09b;
        }
        if (-1 < (int)uVar55) {
          pNVar12 = (pIVar18->data).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .m_elem;
          result_29.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)(pNVar12[uVar55].val.m_backend.data._M_elems + 8);
          result_29.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)&pNVar12[uVar55].val.m_backend.data;
          result_29.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)(pNVar12[uVar55].val.m_backend.data._M_elems + 2);
          puVar3 = pNVar12[uVar55].val.m_backend.data._M_elems + 4;
          result_29.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
          result_29.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
          result_29.m_backend.exp = pNVar12[uVar55].val.m_backend.exp;
          result_29.m_backend.neg = pNVar12[uVar55].val.m_backend.neg;
          result_29.m_backend.fpclass = pNVar12[uVar55].val.m_backend.fpclass;
          result_29.m_backend.prec_elem = pNVar12[uVar55].val.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&result_30.m_backend,&result_29.m_backend);
          piVar59 = &(this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_remNzos;
          *piVar59 = *piVar59 + 1;
        }
        (*(local_dd0->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x43])
                  (local_dd0,(ulong)uVar63,local_d38 & 0xffffffff,&result_30.m_backend,0);
      }
      lVar64 = lVar64 + 1;
    } while (lVar64 < (pIVar1->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  pSVar66 = local_dd0;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::obj(&obj_j,local_dd0,(int)local_d10);
  uVar24 = obj_j.m_backend._48_8_;
  bVar52 = obj_j.m_backend.neg;
  iVar54 = obj_j.m_backend.exp;
  uVar23 = obj_j.m_backend.data._M_elems._32_8_;
  uVar22 = obj_j.m_backend.data._M_elems._24_8_;
  uVar21 = obj_j.m_backend.data._M_elems._16_8_;
  uVar15 = obj_j.m_backend.data._M_elems._8_8_;
  uVar14 = obj_j.m_backend.data._M_elems._0_8_;
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_210,this);
  local_e78._16_4_ = (undefined4)uVar23;
  local_e78._20_4_ = SUB84(uVar23,4);
  local_e78._0_4_ = (undefined4)uVar21;
  local_e78._4_4_ = SUB84(uVar21,4);
  local_e78._8_4_ = (undefined4)uVar22;
  local_e78._12_4_ = SUB84(uVar22,4);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = (uint)uVar14;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = SUB84(uVar14,4);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = (uint)uVar15;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = SUB84(uVar15,4);
  local_e78._24_4_ = iVar54;
  local_e5c[0] = bVar52;
  local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar24;
  local_978 = (fpclass_type)uVar24;
  if ((bVar52 == true) &&
     ((uint)ptr.
            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != 0 || local_978 != cpp_dec_float_finite)) {
    local_e5c[0] = false;
  }
  if (((local_978 != cpp_dec_float_NaN) && (local_210.fpclass != cpp_dec_float_NaN)) &&
     (iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         ((cpp_dec_float<50U,_int,_void> *)&ptr,&local_210), 0 < iVar54)) {
    result_35.m_backend.data._M_elems[7]._1_3_ = aggr_const.m_backend.data._M_elems[7]._1_3_;
    result_35.m_backend.data._M_elems._24_5_ = aggr_const.m_backend.data._M_elems._24_5_;
    result_35.m_backend.data._M_elems[0] = aggr_const.m_backend.data._M_elems[0];
    result_35.m_backend.data._M_elems[1] = aggr_const.m_backend.data._M_elems[1];
    result_35.m_backend.data._M_elems[2] = aggr_const.m_backend.data._M_elems[2];
    result_35.m_backend.data._M_elems[3] = aggr_const.m_backend.data._M_elems[3];
    result_35.m_backend.data._M_elems[4] = aggr_const.m_backend.data._M_elems[4];
    result_35.m_backend.data._M_elems[5] = aggr_const.m_backend.data._M_elems[5];
    result_35.m_backend.data._M_elems[9]._1_3_ = aggr_const.m_backend.data._M_elems[9]._1_3_;
    result_35.m_backend.data._M_elems._32_5_ = aggr_const.m_backend.data._M_elems._32_5_;
    result_35.m_backend.exp = aggr_const.m_backend.exp;
    result_35.m_backend.neg = aggr_const.m_backend.neg;
    result_35.m_backend.fpclass = aggr_const.m_backend.fpclass;
    result_35.m_backend.prec_elem = aggr_const.m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&result_35.m_backend,&obj_j.m_backend);
    (*(this->
      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      )._vptr_SPxSimplifier[0x11])(this,&result_35.m_backend);
    uVar61 = local_d38;
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&ptr,pSVar66,(uint)local_d38);
    result_30.m_backend.data._M_elems[0] = (fpclass_type)local_bc8;
    result_30.m_backend.data._M_elems[9] = local_928;
    result_30.m_backend.data._M_elems[5] = (uint)local_938;
    result_30.m_backend.data._M_elems[6] = (uint)((ulong)local_938 >> 0x20);
    result_30.m_backend.data._M_elems[7] = (uint)uStack_930;
    result_30.m_backend.data._M_elems[8] = (uint)((ulong)uStack_930 >> 0x20);
    result_30.m_backend.data._M_elems[1] = (uint)local_948;
    result_30.m_backend.data._M_elems[2] = (uint)((ulong)local_948 >> 0x20);
    result_30.m_backend.data._M_elems[3] = (uint)uStack_940;
    result_30.m_backend.data._M_elems[4] = (uint)((ulong)uStack_940 >> 0x20);
    result_30.m_backend.exp = uVar30;
    result_30.m_backend.neg = (bool)local_e49;
    result_30.m_backend.prec_elem = local_d30;
    result_30.m_backend.fpclass = local_d2c;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&result_30.m_backend,&obj_j.m_backend);
    pSVar66 = local_dd0;
    result_2.m_backend.data._M_elems[1] =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._4_4_;
    result_2.m_backend.data._M_elems[0] =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    result_2.m_backend.data._M_elems[3] =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi._4_4_;
    result_2.m_backend.data._M_elems[2] =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
    result_2.m_backend.data._M_elems[5] = local_e78._4_4_;
    result_2.m_backend.data._M_elems[4] = local_e78._0_4_;
    result_2.m_backend.data._M_elems._24_5_ = SUB85(CONCAT44(local_e78._12_4_,local_e78._8_4_),0);
    result_2.m_backend.data._M_elems[7]._1_3_ = SUB43(local_e78._12_4_,1);
    result_2.m_backend.data._M_elems._32_5_ = SUB85(CONCAT44(local_e78._20_4_,local_e78._16_4_),0);
    result_2.m_backend.data._M_elems[9]._1_3_ = SUB43(local_e78._20_4_,1);
    result_2.m_backend.exp = local_e78._24_4_;
    result_2.m_backend.neg = local_e5c[0];
    result_2.m_backend._48_8_ = local_e58._M_pi;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
              (&result_2.m_backend,&result_30.m_backend);
    (*(pSVar66->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x24])(pSVar66,uVar61 & 0xffffffff,&result_2.m_backend,0);
  }
  uVar24 = local_d78._48_8_;
  bVar52 = local_d78[0x2c];
  uVar30 = local_d78._40_4_;
  uVar23 = local_d78._32_8_;
  uVar22 = local_d78._24_8_;
  uVar21 = local_d78._16_8_;
  uVar15 = local_d78._8_8_;
  uVar14 = local_d78._0_8_;
  local_5f8._0_8_ = local_e08._0_8_;
  local_5f8._8_8_ = local_e08._8_8_;
  local_5f8._16_8_ = local_e08._16_8_;
  local_5f8._24_8_ = local_e08._24_8_;
  local_5f8._32_8_ = local_e08._32_8_;
  local_5f8._40_4_ = local_e08._40_4_;
  local_5f8[0x2c] = local_e08[0x2c];
  local_5f8._48_8_ = local_e08._48_8_;
  local_bc8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d78._48_8_;
  uStack_bc0 = 0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
            ((cpp_dec_float<50U,_int,_void> *)local_5f8,&local_bb8);
  local_e78._16_4_ = (undefined4)uVar23;
  local_e78._20_4_ = SUB84(uVar23,4);
  local_e78._0_4_ = (undefined4)uVar21;
  local_e78._4_4_ = SUB84(uVar21,4);
  local_e78._8_4_ = (undefined4)uVar22;
  local_e78._12_4_ = SUB84(uVar22,4);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = (uint)uVar14;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = SUB84(uVar14,4);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = (uint)uVar15;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = SUB84(uVar15,4);
  local_e78._24_4_ = uVar30;
  local_e5c[0] = bVar52;
  local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar24;
  if ((bVar52 == true) &&
     ((uint)ptr.
            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != 0 || (fpclass_type)local_bc8 != 0)) {
    local_e5c[0] = false;
  }
  result_2.m_backend.data._M_elems._32_5_ = SUB85(local_5f8._32_8_,0);
  result_2.m_backend.data._M_elems[9]._1_3_ = SUB83(local_5f8._32_8_,5);
  result_2.m_backend.data._M_elems[4] = local_5f8._16_4_;
  result_2.m_backend.data._M_elems[5] = local_5f8._20_4_;
  result_2.m_backend.data._M_elems._24_5_ = SUB85(local_5f8._24_8_,0);
  result_2.m_backend.data._M_elems[7]._1_3_ = SUB83(local_5f8._24_8_,5);
  result_2.m_backend.data._M_elems[0] = local_5f8._0_4_;
  result_2.m_backend.data._M_elems[1] = local_5f8._4_4_;
  uVar14 = result_2.m_backend.data._M_elems._0_8_;
  result_2.m_backend.data._M_elems[2] = local_5f8._8_4_;
  result_2.m_backend.data._M_elems[3] = local_5f8._12_4_;
  result_2.m_backend.exp = local_5f8._40_4_;
  result_2.m_backend.neg = local_5f8[0x2c];
  result_2.m_backend.fpclass = local_5f8._48_4_;
  result_2.m_backend.prec_elem = local_5f8._52_4_;
  if ((local_5f8[0x2c] == true) &&
     (result_2.m_backend.data._M_elems[0] = (uint)local_5f8._0_8_,
     result_2.m_backend.data._M_elems[0] != 0 ||
     (fpclass_type)local_5f8._48_8_ != cpp_dec_float_finite)) {
    result_2.m_backend.neg = false;
  }
  result_2.m_backend.data._M_elems._0_8_ = uVar14;
  if ((fpclass_type)local_5f8._48_8_ == cpp_dec_float_NaN || (fpclass_type)local_bc8 == 2) {
    bVar52 = false;
  }
  else {
    iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       ((cpp_dec_float<50U,_int,_void> *)&ptr,&result_2.m_backend);
    bVar52 = 0 < iVar54;
  }
  uVar24 = local_d78._48_8_;
  bVar53 = local_d78[0x2c];
  uVar30 = local_d78._40_4_;
  uVar23 = local_d78._32_8_;
  uVar22 = local_d78._24_8_;
  uVar21 = local_d78._16_8_;
  uVar15 = local_d78._8_8_;
  uVar14 = local_d78._0_8_;
  pnVar58 = &result_2;
  if (bVar52) {
    pnVar58 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&ptr;
  }
  uVar20 = *(undefined8 *)((pnVar58->m_backend).data._M_elems + 8);
  result_30.m_backend.data._M_elems[8] = (uint)uVar20;
  result_30.m_backend.data._M_elems[9] = (uint)((ulong)uVar20 >> 0x20);
  uVar20 = *(undefined8 *)(pnVar58->m_backend).data._M_elems;
  uVar25 = *(undefined8 *)((pnVar58->m_backend).data._M_elems + 2);
  uVar26 = *(undefined8 *)((pnVar58->m_backend).data._M_elems + 4);
  uVar27 = *(undefined8 *)((pnVar58->m_backend).data._M_elems + 6);
  result_30.m_backend.data._M_elems[4] = (uint)uVar26;
  result_30.m_backend.data._M_elems[5] = (uint)((ulong)uVar26 >> 0x20);
  result_30.m_backend.data._M_elems[6] = (uint)uVar27;
  result_30.m_backend.data._M_elems[7] = (uint)((ulong)uVar27 >> 0x20);
  result_30.m_backend.data._M_elems[0] = (uint)uVar20;
  result_30.m_backend.data._M_elems[1] = (uint)((ulong)uVar20 >> 0x20);
  result_30.m_backend.data._M_elems[2] = (uint)uVar25;
  result_30.m_backend.data._M_elems[3] = (uint)((ulong)uVar25 >> 0x20);
  piVar59 = &result_2.m_backend.exp;
  piVar60 = piVar59;
  if (bVar52) {
    piVar60 = (int *)(local_e78 + 0x18);
  }
  result_30.m_backend.exp = *piVar60;
  pbVar67 = &result_2.m_backend.neg;
  pbVar62 = pbVar67;
  if (bVar52) {
    pbVar62 = local_e5c;
  }
  result_30.m_backend.neg = *pbVar62;
  uVar61 = CONCAT44((int)((uint)bVar52 << 0x1f) >> 0x1f,(int)((uint)bVar52 << 0x1f) >> 0x1f);
  result_30.m_backend._48_8_ = ~uVar61 & result_2.m_backend._48_8_ | (ulong)local_e58._M_pi & uVar61
  ;
  local_638._32_8_ = local_e08._32_8_;
  local_638._16_8_ = local_e08._16_8_;
  local_638._24_8_ = local_e08._24_8_;
  local_638._0_8_ = local_e08._0_8_;
  local_638._8_8_ = local_e08._8_8_;
  local_638._40_4_ = local_e08._40_4_;
  local_638[0x2c] = local_e08[0x2c];
  local_638._48_8_ = local_e08._48_8_;
  local_bc8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d78._48_8_;
  uStack_bc0 = 0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
            ((cpp_dec_float<50U,_int,_void> *)local_638,&local_b78);
  local_e78._16_4_ = (undefined4)uVar23;
  local_e78._20_4_ = SUB84(uVar23,4);
  local_e78._0_4_ = (undefined4)uVar21;
  local_e78._4_4_ = SUB84(uVar21,4);
  local_e78._8_4_ = (undefined4)uVar22;
  local_e78._12_4_ = SUB84(uVar22,4);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = (uint)uVar14;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = SUB84(uVar14,4);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = (uint)uVar15;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = SUB84(uVar15,4);
  local_e78._24_4_ = uVar30;
  local_e5c[0] = bVar53;
  local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar24;
  if ((bVar53 == true) &&
     ((uint)ptr.
            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != 0 || (fpclass_type)local_bc8 != 0)) {
    local_e5c[0] = false;
  }
  result_2.m_backend.data._M_elems._32_5_ = SUB85(local_638._32_8_,0);
  result_2.m_backend.data._M_elems[9]._1_3_ = SUB83(local_638._32_8_,5);
  result_2.m_backend.data._M_elems[4] = local_638._16_4_;
  result_2.m_backend.data._M_elems[5] = local_638._20_4_;
  result_2.m_backend.data._M_elems._24_5_ = SUB85(local_638._24_8_,0);
  result_2.m_backend.data._M_elems[7]._1_3_ = SUB83(local_638._24_8_,5);
  result_2.m_backend.data._M_elems[2] = local_638._8_4_;
  result_2.m_backend.data._M_elems[3] = local_638._12_4_;
  result_2.m_backend.data._M_elems[0] = local_638._0_4_;
  result_2.m_backend.data._M_elems[1] = local_638._4_4_;
  auVar28 = (undefined1  [16])result_2.m_backend.data._M_elems._0_16_;
  result_2.m_backend.exp = local_638._40_4_;
  result_2.m_backend.neg = local_638[0x2c];
  result_2.m_backend.fpclass = local_638._48_4_;
  result_2.m_backend.prec_elem = local_638._52_4_;
  if ((local_638[0x2c] == true) &&
     (result_2.m_backend.data._M_elems[0] = (uint)local_638._0_8_,
     result_2.m_backend.data._M_elems[0] != 0 ||
     (fpclass_type)local_638._48_8_ != cpp_dec_float_finite)) {
    result_2.m_backend.neg = false;
  }
  result_2.m_backend.data._M_elems._0_16_ = auVar28;
  if ((fpclass_type)local_638._48_8_ == cpp_dec_float_NaN || (fpclass_type)local_bc8 == 2) {
    bVar52 = false;
  }
  else {
    iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       ((cpp_dec_float<50U,_int,_void> *)&ptr,&result_2.m_backend);
    bVar52 = 0 < iVar54;
  }
  pnVar58 = &result_2;
  if (bVar52) {
    pnVar58 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&ptr;
  }
  result_29.m_backend.data._M_elems._32_8_ = *(undefined8 *)((pnVar58->m_backend).data._M_elems + 8)
  ;
  result_29.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar58->m_backend).data._M_elems;
  result_29.m_backend.data._M_elems._8_8_ = *(undefined8 *)((pnVar58->m_backend).data._M_elems + 2);
  result_29.m_backend.data._M_elems._16_8_ = *(undefined8 *)((pnVar58->m_backend).data._M_elems + 4)
  ;
  result_29.m_backend.data._M_elems._24_8_ = *(undefined8 *)((pnVar58->m_backend).data._M_elems + 6)
  ;
  if (bVar52) {
    piVar59 = (int *)(local_e78 + 0x18);
  }
  result_29.m_backend.exp = *piVar59;
  if (bVar52) {
    pbVar67 = local_e5c;
  }
  result_29.m_backend.neg = *pbVar67;
  uVar61 = CONCAT44((int)((uint)bVar52 << 0x1f) >> 0x1f,(int)((uint)bVar52 << 0x1f) >> 0x1f);
  result_29.m_backend._48_8_ = ~uVar61 & result_2.m_backend._48_8_ | (ulong)local_e58._M_pi & uVar61
  ;
  if (result_30.m_backend.fpclass != cpp_dec_float_NaN) {
    local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._4_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._4_4_ = 0;
    local_e78._0_4_ = 0;
    local_e78._4_4_ = 0;
    local_e78._8_4_ = 0;
    local_e78._12_4_ = 0;
    local_e78._16_4_ = 0;
    local_e78._20_4_ = 0;
    local_e78._24_4_ = 0;
    local_e5c[0] = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&ptr,1.0);
    iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&result_30.m_backend,(cpp_dec_float<50U,_int,_void> *)&ptr);
    if (iVar54 < 0) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&result_30,1.0);
    }
  }
  if (result_29.m_backend.fpclass != cpp_dec_float_NaN) {
    local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._4_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._4_4_ = 0;
    local_e78._0_4_ = 0;
    local_e78._4_4_ = 0;
    local_e78._8_4_ = 0;
    local_e78._12_4_ = 0;
    local_e78._16_4_ = 0;
    local_e78._20_4_ = 0;
    local_e78._24_4_ = 0;
    local_e5c[0] = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&ptr,1.0);
    iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&result_29.m_backend,(cpp_dec_float<50U,_int,_void> *)&ptr);
    if (iVar54 < 0) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&result_29,1.0);
    }
  }
  local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = 0;
  local_e78._0_4_ = 0;
  local_e78._4_4_ = 0;
  local_e78._8_4_ = 0;
  local_e78._12_4_ = 0;
  local_e78._16_4_ = 0;
  local_e78._20_4_ = 0;
  local_e78._24_4_ = 0;
  local_e5c[0] = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            ((cpp_dec_float<50U,_int,_void> *)&ptr,(cpp_dec_float<50U,_int,_void> *)local_d78,
             &result_30.m_backend);
  result_43.m_backend.data._M_elems[0] = local_e08._0_4_;
  result_43.m_backend.data._M_elems[1] = local_e08._4_4_;
  result_43.m_backend.data._M_elems[2] = local_e08._8_4_;
  result_43.m_backend.data._M_elems[3] = local_e08._12_4_;
  result_43.m_backend.data._M_elems[4] = local_e08._16_4_;
  result_43.m_backend.data._M_elems[5] = local_e08._20_4_;
  result_43.m_backend.data._M_elems._24_5_ = SUB85(local_e08._24_8_,0);
  result_43.m_backend.data._M_elems[7]._1_3_ = SUB83(local_e08._24_8_,5);
  result_43.m_backend.data._M_elems._32_5_ = SUB85(local_e08._32_8_,0);
  result_43.m_backend.data._M_elems[9]._1_3_ = SUB83(local_e08._32_8_,5);
  result_43.m_backend.exp = local_e08._40_4_;
  result_43.m_backend.neg = local_e08[0x2c];
  result_43.m_backend.fpclass = local_e08._48_4_;
  result_43.m_backend.prec_elem = local_e08._52_4_;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
            (&result_43.m_backend,&local_bb8);
  result_44.m_backend.fpclass = cpp_dec_float_finite;
  result_44.m_backend.prec_elem = 10;
  result_44.m_backend.data._M_elems[0] = 0;
  result_44.m_backend.data._M_elems[1] = 0;
  result_44.m_backend.data._M_elems[2] = 0;
  result_44.m_backend.data._M_elems[3] = 0;
  result_44.m_backend.data._M_elems[4] = 0;
  result_44.m_backend.data._M_elems[5] = 0;
  result_44.m_backend.data._M_elems._24_5_ = 0;
  result_44.m_backend.data._M_elems[7]._1_3_ = 0;
  result_44.m_backend.data._M_elems._32_5_ = 0;
  result_44.m_backend.data._M_elems[9]._1_3_ = 0;
  result_44.m_backend.exp = 0;
  result_44.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result_44.m_backend,&result_43.m_backend,&result_30.m_backend);
  result_2.m_backend.data._M_elems[1] =
       ptr.
       super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr._4_4_;
  result_2.m_backend.data._M_elems[0] =
       (uint)ptr.
             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  result_2.m_backend.data._M_elems[3] =
       ptr.
       super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi._4_4_;
  result_2.m_backend.data._M_elems[2] =
       (uint)ptr.
             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
  result_2.m_backend.data._M_elems[5] = local_e78._4_4_;
  result_2.m_backend.data._M_elems[4] = local_e78._0_4_;
  result_2.m_backend.data._M_elems._24_5_ = SUB85(CONCAT44(local_e78._12_4_,local_e78._8_4_),0);
  result_2.m_backend.data._M_elems[7]._1_3_ = SUB43(local_e78._12_4_,1);
  result_2.m_backend.data._M_elems._32_5_ = SUB85(CONCAT44(local_e78._20_4_,local_e78._16_4_),0);
  result_2.m_backend.data._M_elems[9]._1_3_ = SUB43(local_e78._20_4_,1);
  result_2.m_backend.exp = local_e78._24_4_;
  result_2.m_backend.neg = local_e5c[0];
  result_2.m_backend._48_8_ = local_e58._M_pi;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
            (&result_2.m_backend,&result_44.m_backend);
  local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = 0;
  local_e78._0_4_ = 0;
  local_e78._4_4_ = 0;
  local_e78._8_4_ = 0;
  local_e78._12_4_ = 0;
  local_e78._16_4_ = 0;
  local_e78._20_4_ = 0;
  local_e78._24_4_ = 0;
  local_e5c[0] = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            ((cpp_dec_float<50U,_int,_void> *)&ptr,(cpp_dec_float<50U,_int,_void> *)local_d78,
             &result_29.m_backend);
  result_47.m_backend.data._M_elems[0] = local_e08._0_4_;
  result_47.m_backend.data._M_elems[1] = local_e08._4_4_;
  result_47.m_backend.data._M_elems[2] = local_e08._8_4_;
  result_47.m_backend.data._M_elems[3] = local_e08._12_4_;
  result_47.m_backend.data._M_elems[4] = local_e08._16_4_;
  result_47.m_backend.data._M_elems[5] = local_e08._20_4_;
  result_47.m_backend.data._M_elems[6] = local_e08._24_4_;
  result_47.m_backend.data._M_elems[7] = local_e08._28_4_;
  result_47.m_backend.data._M_elems[8] = local_e08._32_4_;
  result_47.m_backend.data._M_elems[9] = local_e08._36_4_;
  result_47.m_backend.exp = local_e08._40_4_;
  result_47.m_backend.neg = local_e08[0x2c];
  result_47.m_backend.fpclass = local_e08._48_4_;
  result_47.m_backend.prec_elem = local_e08._52_4_;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
            (&result_47.m_backend,&local_b78);
  result_43.m_backend.fpclass = cpp_dec_float_finite;
  result_43.m_backend.prec_elem = 10;
  result_43.m_backend.data._M_elems._0_16_ = ZEXT816(0);
  result_43.m_backend.data._M_elems[4] = 0;
  result_43.m_backend.data._M_elems[5] = 0;
  result_43.m_backend.data._M_elems._24_5_ = 0;
  result_43.m_backend.data._M_elems[7]._1_3_ = 0;
  result_43.m_backend.data._M_elems._32_5_ = 0;
  result_43.m_backend.data._M_elems[9]._1_3_ = 0;
  result_43.m_backend.exp = 0;
  result_43.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result_43.m_backend,&result_47.m_backend,&result_29.m_backend);
  result_44.m_backend.data._M_elems[1] =
       ptr.
       super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr._4_4_;
  result_44.m_backend.data._M_elems[0] =
       (uint)ptr.
             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  result_44.m_backend.data._M_elems[3] =
       ptr.
       super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi._4_4_;
  result_44.m_backend.data._M_elems[2] =
       (uint)ptr.
             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
  result_44.m_backend.data._M_elems[5] = local_e78._4_4_;
  result_44.m_backend.data._M_elems[4] = local_e78._0_4_;
  result_44.m_backend.data._M_elems._24_5_ = SUB85(CONCAT44(local_e78._12_4_,local_e78._8_4_),0);
  result_44.m_backend.data._M_elems[7]._1_3_ = SUB43(local_e78._12_4_,1);
  result_44.m_backend.data._M_elems._32_5_ = SUB85(CONCAT44(local_e78._20_4_,local_e78._16_4_),0);
  result_44.m_backend.data._M_elems[9]._1_3_ = SUB43(local_e78._20_4_,1);
  result_44.m_backend.exp = local_e78._24_4_;
  result_44.m_backend.neg = local_e5c[0];
  result_44.m_backend._48_8_ = local_e58._M_pi;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
            (&result_44.m_backend,&result_43.m_backend);
  uVar24 = result_2.m_backend._48_8_;
  bVar52 = result_2.m_backend.neg;
  iVar54 = result_2.m_backend.exp;
  uVar32 = result_2.m_backend.data._M_elems._32_5_;
  uVar31 = result_2.m_backend.data._M_elems._24_5_;
  uVar23 = result_2.m_backend.data._M_elems._16_8_;
  uVar22 = result_2.m_backend.data._M_elems._8_8_;
  uVar21 = result_2.m_backend.data._M_elems._0_8_;
  uVar14 = CONCAT35(result_2.m_backend.data._M_elems[7]._1_3_,
                    result_2.m_backend.data._M_elems._24_5_);
  uVar15 = CONCAT35(result_2.m_backend.data._M_elems[9]._1_3_,
                    result_2.m_backend.data._M_elems._32_5_);
  local_bc8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)result_2.m_backend._48_8_;
  uStack_bc0 = 0;
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_248,this);
  local_e78._16_4_ = (undefined4)uVar32;
  local_e78._20_4_ = (undefined4)((ulong)uVar15 >> 0x20);
  local_e78._0_4_ = (undefined4)uVar23;
  local_e78._4_4_ = SUB84(uVar23,4);
  local_e78._8_4_ = (undefined4)uVar31;
  local_e78._12_4_ = (undefined4)((ulong)uVar14 >> 0x20);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = (uint)uVar21;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = SUB84(uVar21,4);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = (uint)uVar22;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = SUB84(uVar22,4);
  local_e78._24_4_ = iVar54;
  local_e5c[0] = bVar52;
  local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar24;
  if ((bVar52 == true) &&
     ((uint)ptr.
            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != 0 || (fpclass_type)local_bc8 != cpp_dec_float_finite)) {
    local_e5c[0] = false;
  }
  if ((((fpclass_type)local_bc8 != cpp_dec_float_NaN) && (local_248.fpclass != cpp_dec_float_NaN))
     && (iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            ((cpp_dec_float<50U,_int,_void> *)&ptr,&local_248), iVar54 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_2,0.0);
  }
  uVar24 = result_44.m_backend._48_8_;
  bVar52 = result_44.m_backend.neg;
  iVar54 = result_44.m_backend.exp;
  uVar32 = result_44.m_backend.data._M_elems._32_5_;
  uVar31 = result_44.m_backend.data._M_elems._24_5_;
  uVar23 = result_44.m_backend.data._M_elems._16_8_;
  uVar22 = result_44.m_backend.data._M_elems._8_8_;
  uVar21 = result_44.m_backend.data._M_elems._0_8_;
  uVar15 = CONCAT35(result_44.m_backend.data._M_elems[9]._1_3_,
                    result_44.m_backend.data._M_elems._32_5_);
  uVar14 = CONCAT35(result_44.m_backend.data._M_elems[7]._1_3_,
                    result_44.m_backend.data._M_elems._24_5_);
  local_bc8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)result_44.m_backend._48_8_;
  uStack_bc0 = 0;
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_280,this);
  local_e78._16_4_ = (undefined4)uVar32;
  local_e78._20_4_ = (undefined4)((ulong)uVar15 >> 0x20);
  local_e78._0_4_ = (undefined4)uVar23;
  local_e78._4_4_ = SUB84(uVar23,4);
  local_e78._8_4_ = (undefined4)uVar31;
  local_e78._12_4_ = (undefined4)((ulong)uVar14 >> 0x20);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = (uint)uVar21;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = SUB84(uVar21,4);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = (uint)uVar22;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = SUB84(uVar22,4);
  local_e78._24_4_ = iVar54;
  local_e5c[0] = bVar52;
  local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar24;
  if ((bVar52 == true) &&
     ((uint)ptr.
            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != 0 || (fpclass_type)local_bc8 != cpp_dec_float_finite)) {
    local_e5c[0] = false;
  }
  if ((((fpclass_type)local_bc8 != cpp_dec_float_NaN) && (local_280.fpclass != cpp_dec_float_NaN))
     && (iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            ((cpp_dec_float<50U,_int,_void> *)&ptr,&local_280), iVar54 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_44,0.0);
  }
  result_43.m_backend.data._M_elems[0] = local_db8._0_4_;
  result_43.m_backend.data._M_elems[1] = local_db8._4_4_;
  result_43.m_backend.data._M_elems[2] = local_db8._8_4_;
  result_43.m_backend.data._M_elems[3] = local_db8._12_4_;
  result_43.m_backend.data._M_elems[4] = local_db8._16_4_;
  result_43.m_backend.data._M_elems[5] = local_db8._20_4_;
  result_43.m_backend.data._M_elems._24_5_ = SUB85(local_db8._24_8_,0);
  result_43.m_backend.data._M_elems[7]._1_3_ = SUB83(local_db8._24_8_,5);
  result_43.m_backend.data._M_elems._32_5_ = SUB85(local_db8._32_8_,0);
  result_43.m_backend.data._M_elems[9]._1_3_ = SUB83(local_db8._32_8_,5);
  result_43.m_backend.exp = local_db8._40_4_;
  result_43.m_backend.neg = local_db8[0x2c];
  result_43.m_backend.fpclass = local_db8._48_4_;
  result_43.m_backend.prec_elem = local_db8._52_4_;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
            (&result_43.m_backend,(cpp_dec_float<50U,_int,_void> *)local_e08);
  if (result_43.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_002fadf7:
    result_43.m_backend.data._M_elems[2] = local_db8._8_4_;
    result_43.m_backend.data._M_elems[3] = local_db8._12_4_;
    result_43.m_backend.data._M_elems[0] = local_db8._0_4_;
    result_43.m_backend.data._M_elems[1] = local_db8._4_4_;
    result_43.m_backend.data._M_elems[4] = local_db8._16_4_;
    result_43.m_backend.data._M_elems[5] = local_db8._20_4_;
    result_43.m_backend.data._M_elems._24_5_ = SUB85(local_db8._24_8_,0);
    result_43.m_backend.data._M_elems[7]._1_3_ = SUB83(local_db8._24_8_,5);
    result_43.m_backend.data._M_elems._32_5_ = SUB85(local_db8._32_8_,0);
    result_43.m_backend.data._M_elems[9]._1_3_ = SUB83(local_db8._32_8_,5);
    result_43.m_backend.exp = local_db8._40_4_;
    result_43.m_backend.neg = local_db8[0x2c];
    result_43.m_backend.fpclass = local_db8._48_4_;
    result_43.m_backend.prec_elem = local_db8._52_4_;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&result_43.m_backend,(cpp_dec_float<50U,_int,_void> *)local_e08);
    if (result_43.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_002fb901:
      puVar57 = (undefined8 *)__cxa_allocate_exception(0x28);
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_e78;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&ptr,"XMAISM12 This should never happen.","");
      *puVar57 = &PTR__SPxException_006a9ee8;
      puVar57[1] = puVar57 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar57 + 1),
                 ptr.
                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,(long)&(ptr.
                                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_PostStep +
                         CONCAT44(ptr.
                                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi._4_4_,
                                  (uint)ptr.
                                        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi));
      *puVar57 = &PTR__SPxException_006a9ec0;
      __cxa_throw(puVar57,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._4_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._4_4_ = 0;
    local_e78._0_4_ = 0;
    local_e78._4_4_ = 0;
    local_e78._8_4_ = 0;
    local_e78._12_4_ = 0;
    local_e78._16_4_ = 0;
    local_e78._20_4_ = 0;
    local_e78._24_4_ = 0;
    local_e5c[0] = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&ptr,0.0);
    iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&result_43.m_backend,(cpp_dec_float<50U,_int,_void> *)&ptr);
    if (-1 < iVar54) goto LAB_002fb901;
    ::soplex::infinity::__tls_init();
    result_43.m_backend.fpclass = cpp_dec_float_finite;
    result_43.m_backend.prec_elem = 10;
    result_43.m_backend.data._M_elems[0] = 0;
    result_43.m_backend.data._M_elems[1] = 0;
    result_43.m_backend.data._M_elems[2] = 0;
    result_43.m_backend.data._M_elems[3] = 0;
    result_43.m_backend.data._M_elems[4] = 0;
    result_43.m_backend.data._M_elems[5] = 0;
    result_43.m_backend.data._M_elems._24_5_ = 0;
    result_43.m_backend.data._M_elems[7]._1_3_ = 0;
    result_43.m_backend.data._M_elems._32_5_ = 0;
    result_43.m_backend.data._M_elems[9]._1_3_ = 0;
    result_43.m_backend.exp = 0;
    result_43.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_43,local_dc8);
    if (((local_b78.fpclass == cpp_dec_float_NaN) ||
        (result_43.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_b78,&result_43.m_backend), 0 < iVar54)) {
      result_47.m_backend.data._M_elems[7]._1_3_ = result_44.m_backend.data._M_elems[7]._1_3_;
      result_47.m_backend.data._M_elems._24_5_ = result_44.m_backend.data._M_elems._24_5_;
      result_47.m_backend.data._M_elems[0] = result_44.m_backend.data._M_elems[0];
      result_47.m_backend.data._M_elems[1] = result_44.m_backend.data._M_elems[1];
      result_47.m_backend.data._M_elems[2] = result_44.m_backend.data._M_elems[2];
      result_47.m_backend.data._M_elems[3] = result_44.m_backend.data._M_elems[3];
      result_47.m_backend.data._M_elems[4] = result_44.m_backend.data._M_elems[4];
      result_47.m_backend.data._M_elems[5] = result_44.m_backend.data._M_elems[5];
      result_47.m_backend.data._M_elems[9]._1_3_ = result_44.m_backend.data._M_elems[9]._1_3_;
      result_47.m_backend.data._M_elems._32_5_ = result_44.m_backend.data._M_elems._32_5_;
      result_47.m_backend.exp = result_44.m_backend.exp;
      result_47.m_backend.neg = result_44.m_backend.neg;
      result_47.m_backend.fpclass = result_44.m_backend.fpclass;
      result_47.m_backend.prec_elem = result_44.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&result_47.m_backend,&result_29.m_backend);
      local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e78._0_4_ = 0;
      local_e78._4_4_ = 0;
      local_e78._8_4_ = 0;
      local_e78._12_4_ = 0;
      local_e78._16_4_ = 0;
      local_e78._20_4_ = 0;
      local_e78._24_4_ = 0;
      local_e5c[0] = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)&ptr,&result_47.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)local_db8);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e78._0_4_ = 0;
      local_e78._4_4_ = 0;
      local_e78._8_4_ = 0;
      local_e78._12_4_ = 0;
      local_e78._16_4_ = 0;
      local_e78._20_4_ = 0;
      local_e78._24_4_ = 0;
      local_e5c[0] = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&ptr,local_dc8);
    }
    local_c08._36_4_ = local_e78._20_4_;
    local_c08._32_4_ = local_e78._16_4_;
    local_c08._4_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._4_4_;
    local_c08._0_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    local_c08._12_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi._4_4_;
    local_c08._8_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
    local_c08._20_4_ = local_e78._4_4_;
    local_c08._16_4_ = local_e78._0_4_;
    local_c08._24_5_ = (undefined5)CONCAT44(local_e78._12_4_,local_e78._8_4_);
    local_c08._29_3_ = SUB43(local_e78._12_4_,1);
    local_c08._40_4_ = local_e78._24_4_;
    local_c08[0x2c] = local_e5c[0];
    local_bd8 = local_e58._M_pi;
    ::soplex::infinity::__tls_init();
    result_43.m_backend.fpclass = cpp_dec_float_finite;
    result_43.m_backend.prec_elem = 10;
    result_43.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_43.m_backend.data._M_elems[4] = 0;
    result_43.m_backend.data._M_elems[5] = 0;
    result_43.m_backend.data._M_elems._24_5_ = 0;
    result_43.m_backend.data._M_elems[7]._1_3_ = 0;
    result_43.m_backend.data._M_elems._32_5_ = 0;
    result_43.m_backend.data._M_elems[9]._1_3_ = 0;
    result_43.m_backend.exp = 0;
    result_43.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_43,(double)local_d28._0_8_);
    if (((local_bb8.fpclass == cpp_dec_float_NaN) ||
        (result_43.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_bb8,&result_43.m_backend), iVar54 < 0)) {
      result_47.m_backend.data._M_elems[7]._1_3_ = result_2.m_backend.data._M_elems[7]._1_3_;
      result_47.m_backend.data._M_elems._24_5_ = result_2.m_backend.data._M_elems._24_5_;
      result_47.m_backend.data._M_elems[0] = result_2.m_backend.data._M_elems[0];
      result_47.m_backend.data._M_elems[1] = result_2.m_backend.data._M_elems[1];
      result_47.m_backend.data._M_elems[2] = result_2.m_backend.data._M_elems[2];
      result_47.m_backend.data._M_elems[3] = result_2.m_backend.data._M_elems[3];
      result_47.m_backend.data._M_elems[4] = result_2.m_backend.data._M_elems[4];
      result_47.m_backend.data._M_elems[5] = result_2.m_backend.data._M_elems[5];
      result_47.m_backend.data._M_elems[9]._1_3_ = result_2.m_backend.data._M_elems[9]._1_3_;
      result_47.m_backend.data._M_elems._32_5_ = result_2.m_backend.data._M_elems._32_5_;
      result_47.m_backend.exp = result_2.m_backend.exp;
      result_47.m_backend.neg = result_2.m_backend.neg;
      result_47.m_backend.fpclass = result_2.m_backend.fpclass;
      result_47.m_backend.prec_elem = result_2.m_backend.prec_elem;
      pcVar65 = &result_30.m_backend;
      goto LAB_002fb200;
    }
  }
  else {
    local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._4_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._0_4_ = 0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._4_4_ = 0;
    local_e78._0_4_ = 0;
    local_e78._4_4_ = 0;
    local_e78._8_4_ = 0;
    local_e78._12_4_ = 0;
    local_e78._16_4_ = 0;
    local_e78._20_4_ = 0;
    local_e78._24_4_ = 0;
    local_e5c[0] = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&ptr,0.0);
    iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&result_43.m_backend,(cpp_dec_float<50U,_int,_void> *)&ptr);
    if (iVar54 < 1) goto LAB_002fadf7;
    ::soplex::infinity::__tls_init();
    result_43.m_backend.fpclass = cpp_dec_float_finite;
    result_43.m_backend.prec_elem = 10;
    result_43.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_43.m_backend.data._M_elems[4] = 0;
    result_43.m_backend.data._M_elems[5] = 0;
    result_43.m_backend.data._M_elems._24_5_ = 0;
    result_43.m_backend.data._M_elems[7]._1_3_ = 0;
    result_43.m_backend.data._M_elems._32_5_ = 0;
    result_43.m_backend.data._M_elems[9]._1_3_ = 0;
    result_43.m_backend.exp = 0;
    result_43.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_43,(double)local_d28._0_8_);
    if (((local_bb8.fpclass == cpp_dec_float_NaN) ||
        (result_43.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_bb8,&result_43.m_backend), iVar54 < 0)) {
      result_47.m_backend.data._M_elems[7]._1_3_ = result_2.m_backend.data._M_elems[7]._1_3_;
      result_47.m_backend.data._M_elems._24_5_ = result_2.m_backend.data._M_elems._24_5_;
      result_47.m_backend.data._M_elems[0] = result_2.m_backend.data._M_elems[0];
      result_47.m_backend.data._M_elems[1] = result_2.m_backend.data._M_elems[1];
      result_47.m_backend.data._M_elems[2] = result_2.m_backend.data._M_elems[2];
      result_47.m_backend.data._M_elems[3] = result_2.m_backend.data._M_elems[3];
      result_47.m_backend.data._M_elems[4] = result_2.m_backend.data._M_elems[4];
      result_47.m_backend.data._M_elems[5] = result_2.m_backend.data._M_elems[5];
      result_47.m_backend.data._M_elems[9]._1_3_ = result_2.m_backend.data._M_elems[9]._1_3_;
      result_47.m_backend.data._M_elems._32_5_ = result_2.m_backend.data._M_elems._32_5_;
      result_47.m_backend.exp = result_2.m_backend.exp;
      result_47.m_backend.neg = result_2.m_backend.neg;
      result_47.m_backend.fpclass = result_2.m_backend.fpclass;
      result_47.m_backend.prec_elem = result_2.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&result_47.m_backend,&result_30.m_backend);
      local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e78._0_4_ = 0;
      local_e78._4_4_ = 0;
      local_e78._8_4_ = 0;
      local_e78._12_4_ = 0;
      local_e78._16_4_ = 0;
      local_e78._20_4_ = 0;
      local_e78._24_4_ = 0;
      local_e5c[0] = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)&ptr,&result_47.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)local_db8);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e78._0_4_ = 0;
      local_e78._4_4_ = 0;
      local_e78._8_4_ = 0;
      local_e78._12_4_ = 0;
      local_e78._16_4_ = 0;
      local_e78._20_4_ = 0;
      local_e78._24_4_ = 0;
      local_e5c[0] = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&ptr,local_dc8);
    }
    local_c08._36_4_ = local_e78._20_4_;
    local_c08._32_4_ = local_e78._16_4_;
    local_c08._4_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._4_4_;
    local_c08._0_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    local_c08._12_4_ =
         ptr.
         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi._4_4_;
    local_c08._8_4_ =
         (uint)ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
    local_c08._20_4_ = local_e78._4_4_;
    local_c08._16_4_ = local_e78._0_4_;
    local_c08._24_5_ = (undefined5)CONCAT44(local_e78._12_4_,local_e78._8_4_);
    local_c08._29_3_ = SUB43(local_e78._12_4_,1);
    local_c08._40_4_ = local_e78._24_4_;
    local_c08[0x2c] = local_e5c[0];
    local_bd8 = local_e58._M_pi;
    ::soplex::infinity::__tls_init();
    result_43.m_backend.fpclass = cpp_dec_float_finite;
    result_43.m_backend.prec_elem = 10;
    result_43.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_43.m_backend.data._M_elems[4] = 0;
    result_43.m_backend.data._M_elems[5] = 0;
    result_43.m_backend.data._M_elems._24_5_ = 0;
    result_43.m_backend.data._M_elems[7]._1_3_ = 0;
    result_43.m_backend.data._M_elems._32_5_ = 0;
    result_43.m_backend.data._M_elems[9]._1_3_ = 0;
    result_43.m_backend.exp = 0;
    result_43.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_43,local_dc8);
    if (((local_b78.fpclass == cpp_dec_float_NaN) ||
        (result_43.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_b78,&result_43.m_backend), 0 < iVar54)) {
      result_47.m_backend.data._M_elems[7]._1_3_ = result_44.m_backend.data._M_elems[7]._1_3_;
      result_47.m_backend.data._M_elems._24_5_ = result_44.m_backend.data._M_elems._24_5_;
      result_47.m_backend.data._M_elems[0] = result_44.m_backend.data._M_elems[0];
      result_47.m_backend.data._M_elems[1] = result_44.m_backend.data._M_elems[1];
      result_47.m_backend.data._M_elems[2] = result_44.m_backend.data._M_elems[2];
      result_47.m_backend.data._M_elems[3] = result_44.m_backend.data._M_elems[3];
      result_47.m_backend.data._M_elems[4] = result_44.m_backend.data._M_elems[4];
      result_47.m_backend.data._M_elems[5] = result_44.m_backend.data._M_elems[5];
      result_47.m_backend.data._M_elems[9]._1_3_ = result_44.m_backend.data._M_elems[9]._1_3_;
      result_47.m_backend.data._M_elems._32_5_ = result_44.m_backend.data._M_elems._32_5_;
      result_47.m_backend.exp = result_44.m_backend.exp;
      result_47.m_backend.neg = result_44.m_backend.neg;
      result_47.m_backend.fpclass = result_44.m_backend.fpclass;
      result_47.m_backend.prec_elem = result_44.m_backend.prec_elem;
      pcVar65 = &result_29.m_backend;
LAB_002fb200:
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&result_47.m_backend,pcVar65);
      local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._4_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_4_ = 0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      local_e78._0_4_ = 0;
      local_e78._4_4_ = 0;
      local_e78._8_4_ = 0;
      local_e78._12_4_ = 0;
      local_e78._16_4_ = 0;
      local_e78._20_4_ = 0;
      local_e78._24_4_ = 0;
      local_e5c[0] = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)&ptr,&result_47.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)local_db8);
      goto LAB_002fb296;
    }
  }
  ::soplex::infinity::__tls_init();
  local_e58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa00000000;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = 0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = 0;
  local_e78._0_4_ = 0;
  local_e78._4_4_ = 0;
  local_e78._8_4_ = 0;
  local_e78._12_4_ = 0;
  local_e78._16_4_ = 0;
  local_e78._20_4_ = 0;
  local_e78._24_4_ = 0;
  local_e5c[0] = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&ptr,(double)local_d28._0_8_);
LAB_002fb296:
  p_Var17 = local_bd8;
  bVar52 = local_c08[0x2c];
  uVar30 = local_c08._40_4_;
  uVar22 = local_c08._32_8_;
  uVar31 = local_c08._24_5_;
  uVar21 = local_c08._16_8_;
  auVar28 = local_c08._0_16_;
  uVar15 = local_cc8._48_8_;
  local_c48._36_4_ = local_e78._20_4_;
  local_c48._32_4_ = local_e78._16_4_;
  local_c48._4_4_ =
       ptr.
       super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr._4_4_;
  local_c48._0_4_ =
       (uint)ptr.
             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  local_c48._12_4_ =
       ptr.
       super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi._4_4_;
  local_c48._8_4_ =
       (uint)ptr.
             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
  local_c48._20_4_ = local_e78._4_4_;
  local_c48._16_4_ = local_e78._0_4_;
  local_c48._24_5_ = (undefined5)CONCAT44(local_e78._12_4_,local_e78._8_4_);
  local_c48._29_3_ = SUB43(local_e78._12_4_,1);
  local_c48._40_4_ = local_e78._24_4_;
  local_c48[0x2c] = local_e5c[0];
  local_c18 = local_e58._M_pi;
  result_43.m_backend.data._M_elems._32_5_ = local_c88.data._M_elems._32_5_;
  result_43.m_backend.data._M_elems[9]._1_3_ = local_c88.data._M_elems[9]._1_3_;
  result_43.m_backend.data._M_elems[4] = local_c88.data._M_elems[4];
  result_43.m_backend.data._M_elems[5] = local_c88.data._M_elems[5];
  result_43.m_backend.data._M_elems._24_5_ = local_c88.data._M_elems._24_5_;
  result_43.m_backend.data._M_elems[7]._1_3_ = local_c88.data._M_elems[7]._1_3_;
  result_43.m_backend.data._M_elems[2] = local_c88.data._M_elems[2];
  result_43.m_backend.data._M_elems[3] = local_c88.data._M_elems[3];
  result_43.m_backend.data._M_elems[0] = local_c88.data._M_elems[0];
  result_43.m_backend.data._M_elems[1] = local_c88.data._M_elems[1];
  fVar6 = local_c88.fpclass;
  result_47.m_backend.data._M_elems[8] = local_cc8.data._M_elems[8];
  result_47.m_backend.data._M_elems[9] = local_cc8.data._M_elems[9];
  result_47.m_backend.data._M_elems[4] = local_cc8.data._M_elems[4];
  result_47.m_backend.data._M_elems[5] = local_cc8.data._M_elems[5];
  result_47.m_backend.data._M_elems[6] = local_cc8.data._M_elems[6];
  result_47.m_backend.data._M_elems[7] = local_cc8.data._M_elems[7];
  result_47.m_backend.data._M_elems[0] = local_cc8.data._M_elems[0];
  result_47.m_backend.data._M_elems[1] = local_cc8.data._M_elems[1];
  result_47.m_backend.data._M_elems[2] = local_cc8.data._M_elems[2];
  result_47.m_backend.data._M_elems[3] = local_cc8.data._M_elems[3];
  local_d2c = local_cc8.exp;
  local_d30 = CONCAT31(local_d30._1_3_,local_cc8.neg);
  uVar14 = CONCAT35(local_c08._29_3_,local_c08._24_5_);
  local_e8.data._M_elems[8] = local_c88.data._M_elems[8];
  local_e8.data._M_elems[9] = local_c88.data._M_elems[9];
  local_e8.data._M_elems[4] = local_c88.data._M_elems[4];
  local_e8.data._M_elems[5] = local_c88.data._M_elems[5];
  local_e8.data._M_elems[6] = local_c88.data._M_elems[6];
  local_e8.data._M_elems[7] = local_c88.data._M_elems[7];
  local_e8.data._M_elems[0] = local_c88.data._M_elems[0];
  local_e8.data._M_elems[1] = local_c88.data._M_elems[1];
  local_e8.data._M_elems[2] = local_c88.data._M_elems[2];
  local_e8.data._M_elems[3] = local_c88.data._M_elems[3];
  local_dc8 = (double)CONCAT44(local_dc8._4_4_,local_c88.exp);
  local_e8.exp = local_c88.exp;
  local_d28[0] = local_c88.neg;
  local_e8.neg = local_c88.neg;
  local_e8.fpclass = local_c88.fpclass;
  local_bc8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT44(local_bc8._4_4_,local_c88.prec_elem);
  local_e8.prec_elem = local_c88.prec_elem;
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_2b8,this);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = auVar28._0_4_;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = auVar28._4_4_;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = auVar28._8_4_;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = auVar28._12_4_;
  local_e78._0_4_ = (undefined4)uVar21;
  local_e78._4_4_ = SUB84(uVar21,4);
  local_e78._8_4_ = (undefined4)uVar31;
  local_e78._12_4_ = (undefined4)((ulong)uVar14 >> 0x20);
  local_e78._16_4_ = (undefined4)uVar22;
  local_e78._20_4_ = SUB84(uVar22,4);
  local_e78._24_4_ = uVar30;
  local_e5c[0] = bVar52;
  local_e58._M_pi = p_Var17;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
            ((cpp_dec_float<50U,_int,_void> *)&ptr,&local_e8);
  if (((fpclass_type)local_e58._M_pi == cpp_dec_float_NaN) ||
     (local_2b8.fpclass == cpp_dec_float_NaN)) {
    uVar63 = (uint)local_d38;
  }
  else {
    iVar54 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       ((cpp_dec_float<50U,_int,_void> *)&ptr,&local_2b8);
    uVar63 = (uint)local_d38;
    if (0 < iVar54) {
      (*(local_dd0->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x2a])(local_dd0,local_d38 & 0xffffffff,local_c08,0);
      piVar59 = &(this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_chgBnds;
      *piVar59 = *piVar59 + 1;
    }
  }
  local_128._32_8_ = local_c48._32_8_;
  local_128._29_3_ = local_c48._29_3_;
  local_128._24_5_ = local_c48._24_5_;
  local_128._16_8_ = local_c48._16_8_;
  local_128._0_8_ = local_c48._0_8_;
  local_128._8_8_ = local_c48._8_8_;
  local_128._40_4_ = local_c48._40_4_;
  local_128[0x2c] = local_c48[0x2c];
  local_128._48_8_ = local_c18;
  local_168.m_backend.data._M_elems[0] = local_cc8.data._M_elems[0];
  local_168.m_backend.data._M_elems[1] = local_cc8.data._M_elems[1];
  local_168.m_backend.data._M_elems[2] = local_cc8.data._M_elems[2];
  local_168.m_backend.data._M_elems[3] = local_cc8.data._M_elems[3];
  local_168.m_backend.data._M_elems[4] = local_cc8.data._M_elems[4];
  local_168.m_backend.data._M_elems[5] = local_cc8.data._M_elems[5];
  local_168.m_backend.data._M_elems[6] = local_cc8.data._M_elems[6];
  local_168.m_backend.data._M_elems[7] = local_cc8.data._M_elems[7];
  local_168.m_backend.data._M_elems[8] = local_cc8.data._M_elems[8];
  local_168.m_backend.data._M_elems[9] = local_cc8.data._M_elems[9];
  local_168.m_backend.exp = local_cc8.exp;
  local_168.m_backend.neg = local_cc8.neg;
  local_168.m_backend.fpclass = local_cc8.fpclass;
  local_168.m_backend.prec_elem = local_cc8.prec_elem;
  epsZero(&local_68,this);
  bVar52 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)local_128,&local_168,&local_68);
  if (bVar52) {
    (*(local_dd0->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2d])(local_dd0,(ulong)uVar63,local_c48,0);
    piVar59 = &(this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_chgBnds;
    *piVar59 = *piVar59 + 1;
  }
  this_00 = (AggregationPS *)operator_new(0x1c8);
  auVar28 = (undefined1  [16])result_43.m_backend.data._M_elems._0_16_;
  uVar14 = local_cc8._48_8_;
  uVar61 = local_d10;
  pSVar66 = local_dd0;
  iVar54 = *i;
  local_678._0_8_ = local_d78._0_8_;
  local_678._8_8_ = local_d78._8_8_;
  local_678._16_8_ = local_d78._16_8_;
  local_678._24_8_ = local_d78._24_8_;
  local_678._32_8_ = local_d78._32_8_;
  local_678._40_4_ = local_d78._40_4_;
  local_678[0x2c] = local_d78[0x2c];
  local_678._48_8_ = local_d78._48_8_;
  local_6b8.m_backend.data._M_elems[8] = result_47.m_backend.data._M_elems[8];
  local_6b8.m_backend.data._M_elems[9] = result_47.m_backend.data._M_elems[9];
  local_6b8.m_backend.data._M_elems[4] = result_47.m_backend.data._M_elems[4];
  local_6b8.m_backend.data._M_elems[5] = result_47.m_backend.data._M_elems[5];
  local_6b8.m_backend.data._M_elems[6] = result_47.m_backend.data._M_elems[6];
  local_6b8.m_backend.data._M_elems[7] = result_47.m_backend.data._M_elems[7];
  local_6b8.m_backend.data._M_elems[0] = result_47.m_backend.data._M_elems[0];
  local_6b8.m_backend.data._M_elems[1] = result_47.m_backend.data._M_elems[1];
  local_6b8.m_backend.data._M_elems[2] = result_47.m_backend.data._M_elems[2];
  local_6b8.m_backend.data._M_elems[3] = result_47.m_backend.data._M_elems[3];
  local_6b8.m_backend.exp = local_d2c;
  local_6b8.m_backend.neg = (bool)(undefined1)local_d30;
  local_cc8.fpclass = (fpclass_type)uVar15;
  local_cc8.prec_elem = SUB84(uVar15,4);
  local_6b8.m_backend.fpclass = local_cc8.fpclass;
  local_6b8.m_backend.prec_elem = local_cc8.prec_elem;
  local_6f8.m_backend.data._M_elems[7]._1_3_ = result_43.m_backend.data._M_elems[7]._1_3_;
  local_6f8.m_backend.data._M_elems._24_5_ = result_43.m_backend.data._M_elems._24_5_;
  local_6f8.m_backend.data._M_elems[0] = result_43.m_backend.data._M_elems[0];
  local_6f8.m_backend.data._M_elems[1] = result_43.m_backend.data._M_elems[1];
  local_6f8.m_backend.data._M_elems[2] = result_43.m_backend.data._M_elems[2];
  local_6f8.m_backend.data._M_elems[3] = result_43.m_backend.data._M_elems[3];
  local_6f8.m_backend.data._M_elems[4] = result_43.m_backend.data._M_elems[4];
  local_6f8.m_backend.data._M_elems[5] = result_43.m_backend.data._M_elems[5];
  local_6f8.m_backend.data._M_elems[9]._1_3_ = result_43.m_backend.data._M_elems[9]._1_3_;
  local_6f8.m_backend.data._M_elems._32_5_ = result_43.m_backend.data._M_elems._32_5_;
  local_6f8.m_backend.exp = local_dc8._0_4_;
  local_6f8.m_backend.neg = (bool)local_d28[0];
  local_6f8.m_backend.fpclass = fVar6;
  local_6f8.m_backend.prec_elem = (fpclass_type)local_bc8;
  local_958.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_958.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_958.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_958.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_958.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_958.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_958.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  local_cc8._48_8_ = uVar14;
  result_43.m_backend.data._M_elems._0_16_ = auVar28;
  AggregationPS::AggregationPS
            (this_00,local_dd0,iVar54,(int)local_d10,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_678,&local_6b8,&local_6f8,&local_958);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = (uint)this_00;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = (uint)((ulong)this_00 >> 0x20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::AggregationPS*>
            (&ptr.
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,this_00);
  if (local_958.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_958.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
  ::push_back(&(this->m_hist).data,&ptr);
  piVar59 = (this->m_rIdx).data;
  piVar59[*i] = piVar59[(long)(pSVar66->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum + -1];
  (*(pSVar66->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0xf])(pSVar66);
  piVar59 = (this->m_cIdx).data;
  piVar59[local_920] =
       piVar59[(long)(pSVar66->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum + -1];
  (*(pSVar66->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x15])(pSVar66,uVar61 & 0xffffffff);
  uVar4 = (this->
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_remRows;
  uVar5 = (this->
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_remCols;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_remRows = uVar4 + 1;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_remCols = uVar5 + 1;
  piVar59 = &(this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_remNzos;
  *piVar59 = *piVar59 + 2;
  piVar59 = (this->m_stat).data + 0xf;
  *piVar59 = *piVar59 + 1;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi._4_4_,
               (uint)ptr.
                     super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(ptr.
                        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi._4_4_,
                        (uint)ptr.
                              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi));
  }
  return OKAY;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::aggregateVars(SPxLPBase<R>& lp,
      const SVectorBase<R>& row, int& i)
{
   assert(row.size() == 2);
   assert(EQrel(lp.lhs(i), lp.rhs(i), feastol()));

   R rhs = lp.rhs(i);
   assert(rhs < R(infinity) && rhs > R(-infinity));

   int j = row.index(0);
   int k = row.index(1);
   R aij = row.value(0);
   R aik = row.value(1);
   R lower_j = lp.lower(j);
   R upper_j = lp.upper(j);
   R lower_k = lp.lower(k);
   R upper_k = lp.upper(k);

   // fixed variables should be removed by simplifyCols()
   if(EQrel(lower_j, upper_j, feastol()) || EQrel(lower_k, upper_k, feastol()))
      return this->OKAY;

   assert(isNotZero(aij, this->epsZero()) && isNotZero(aik, this->epsZero()));

   SPxOut::debug(this, "IMAISM23 row {}: doubleton equation -> {} x_{} + {} x_{} = {}", i, aij, j, aik,
                 k, rhs);

   // determine which variable can be aggregated without requiring bound tightening of the other variable
   R new_lo_j;
   R new_up_j;
   R new_lo_k;
   R new_up_k;

   if(aij * aik < 0.0)
   {
      // orientation persists
      new_lo_j = (upper_k >=  R(infinity)) ? R(-infinity) : (rhs - aik * upper_k) / aij;
      new_up_j = (lower_k <= R(-infinity)) ?  R(infinity) : (rhs - aik * lower_k) / aij;
      new_lo_k = (upper_j >=  R(infinity)) ? R(-infinity) : (rhs - aij * upper_j) / aik;
      new_up_k = (lower_j <= R(-infinity)) ?  R(infinity) : (rhs - aij * lower_j) / aik;
   }
   else if(aij * aik > 0.0)
   {
      // orientation is reversed
      new_lo_j = (lower_k <= R(-infinity)) ? R(-infinity) : (rhs - aik * lower_k) / aij;
      new_up_j = (upper_k >=  R(infinity)) ?  R(infinity) : (rhs - aik * upper_k) / aij;
      new_lo_k = (lower_j <= R(-infinity)) ? R(-infinity) : (rhs - aij * lower_j) / aik;
      new_up_k = (upper_j >=  R(infinity)) ?  R(infinity) : (rhs - aij * upper_j) / aik;
   }
   else
      throw SPxInternalCodeException("XMAISM12 This should never happen.");

   bool flip_jk = false;

   if(new_lo_j <= R(-infinity) && new_up_j >= R(infinity))
   {
      // no bound tightening on x_j when x_k is aggregated
      flip_jk = true;
   }
   else if(new_lo_k <= R(-infinity) && new_up_k >= R(infinity))
   {
      // no bound tightening on x_k when x_j is aggregated
      flip_jk = false;
   }
   else if(LE(new_lo_j, lower_j, this->tolerances()->epsilon())
           && GE(new_up_j, upper_j, this->tolerances()->epsilon()))
   {
      if(LE(new_lo_k, lower_k, this->tolerances()->epsilon())
            && GE(new_up_k, upper_k, this->tolerances()->epsilon()))
      {
         // both variables' bounds are not affected by aggregation; choose the better aggregation coeff (aik/aij)
         if(spxAbs(aij) > spxAbs(aik))
            flip_jk = false;
         else
            flip_jk = true;
      }
      else
         flip_jk = false;
   }
   else if(LE(new_lo_k, lower_k, this->tolerances()->epsilon())
           && GE(new_up_k, upper_k, this->tolerances()->epsilon()))
   {
      flip_jk = true;
   }
   else
   {
      if(spxAbs(aij) > spxAbs(aik))
         flip_jk = false;
      else
         flip_jk = true;
   }

   if(flip_jk)
   {
      int _j = j;
      R _aij = aij;
      R _lower_j = lower_j;
      R _upper_j = upper_j;
      j = k;
      k = _j;
      aij = aik;
      aik = _aij;
      lower_j = lower_k;
      lower_k = _lower_j;
      upper_j = upper_k;
      upper_k = _upper_j;
   }

   const SVectorBase<R>& col_j = lp.colVector(j);
   const SVectorBase<R>& col_k = lp.colVector(k);

   // aggregation coefficients (x_j = aggr_coef * x_k + aggr_const)
   R aggr_coef = - (aik / aij);
   R aggr_const = rhs / aij;

   SPxOut::debug(this, " removed, replacing x_{} with {} + {} * x_{}\n", j, aggr_const, aggr_coef, k);

   // replace all occurrences of x_j
   for(int r = 0; r < col_j.size(); ++r)
   {
      int row_r = col_j.index(r);
      R arj = col_j.value(r);

      // skip row i
      if(row_r == i)
         continue;

      // adapt sides of row r
      R lhs_r = lp.lhs(row_r);
      R rhs_r = lp.rhs(row_r);

      if(lhs_r > R(-infinity))
      {
         lp.changeLhs(row_r, lhs_r - aggr_const * arj);
         this->m_chgLRhs++;
      }

      if(rhs_r < R(infinity))
      {
         lp.changeRhs(row_r, rhs_r - aggr_const * arj);
         this->m_chgLRhs++;
      }

      R newcoef = aggr_coef * arj;
      int pos_rk = col_k.pos(row_r);

      // check whether x_k is also present in row r and get its coefficient
      if(pos_rk >= 0)
      {
         R ark = col_k.value(pos_rk);
         newcoef += ark;
         this->m_remNzos++;
      }

      // add new column k to row r or adapt the coefficient a_rk
      lp.changeElement(row_r, k, newcoef);
   }

   // adapt objective function
   R obj_j = lp.obj(j);

   if(isNotZero(obj_j, this->epsZero()))
   {
      this->addObjoffset(aggr_const * obj_j);
      R obj_k = lp.obj(k);
      lp.changeObj(k, obj_k + aggr_coef * obj_j);
   }

   // adapt bounds of x_k
   R scale1 = maxAbs(rhs, aij * upper_j);
   R scale2 = maxAbs(rhs, aij * lower_j);

   if(scale1 < 1.0)
      scale1 = 1.0;

   if(scale2 < 1.0)
      scale2 = 1.0;

   R z1 = (rhs / scale1) - (aij * upper_j / scale1);
   R z2 = (rhs / scale2) - (aij * lower_j / scale2);

   // just some rounding
   if(isZero(z1, this->epsZero()))
      z1 = 0.0;

   if(isZero(z2, this->epsZero()))
      z2 = 0.0;

   // determine which side has to be used for the bounds comparison below
   if(aik * aij > 0.0)
   {
      new_lo_k = (upper_j >=  R(infinity)) ? R(-infinity) : z1 * scale1 / aik;
      new_up_k = (lower_j <= R(-infinity)) ?  R(infinity) : z2 * scale2 / aik;
   }
   else if(aik * aij < 0.0)
   {
      new_lo_k = (lower_j <= R(-infinity)) ? R(-infinity) : z2 * scale2 / aik;
      new_up_k = (upper_j >=  R(infinity)) ?  R(infinity) : z1 * scale1 / aik;
   }
   else
      throw SPxInternalCodeException("XMAISM12 This should never happen.");

   // change bounds of x_k if the new ones are tighter
   R oldlower_k = lower_k;
   R oldupper_k = upper_k;

   if(GT(new_lo_k, lower_k, this->epsZero()))
   {
      lp.changeLower(k, new_lo_k);
      this->m_chgBnds++;
   }

   if(LT(new_up_k, upper_k, this->epsZero()))
   {
      lp.changeUpper(k, new_up_k);
      this->m_chgBnds++;
   }

   std::shared_ptr<PostStep> ptr(new AggregationPS(lp, i, j, rhs, oldupper_k, oldlower_k,
                                 this->_tolerances));
   m_hist.append(ptr);

   removeRow(lp, i);
   removeCol(lp, j);

   this->m_remRows++;
   this->m_remCols++;
   this->m_remNzos += 2;

   ++m_stat[AGGREGATION];

   return this->OKAY;
}